

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<8,8>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive PVar1;
  uint uVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  RTCRayQueryContext *pRVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [12];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  byte bVar70;
  byte bVar71;
  byte bVar72;
  ulong uVar73;
  byte bVar74;
  byte bVar75;
  ulong uVar76;
  int iVar77;
  ulong uVar78;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  uint uVar79;
  long lVar80;
  byte bVar81;
  uint uVar82;
  uint uVar83;
  uint uVar147;
  uint uVar148;
  uint uVar150;
  uint uVar151;
  uint uVar152;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  uint uVar149;
  uint uVar153;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float pp;
  float fVar154;
  float fVar155;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar171;
  float fVar172;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar162 [32];
  float fVar173;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar177;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar178 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar193;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  float fVar214;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar230;
  float fVar231;
  float fVar232;
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  float fVar233;
  float fVar242;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar240;
  float fVar241;
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar246;
  undefined1 auVar245 [64];
  undefined1 auVar247 [32];
  undefined1 auVar250 [32];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar251 [64];
  float fVar252;
  float fVar259;
  undefined1 auVar255 [32];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar257;
  float fVar258;
  undefined1 auVar256 [64];
  undefined1 auVar260 [16];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  float fVar264;
  undefined1 auVar263 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [64];
  undefined1 auVar269 [32];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  undefined1 auVar274 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_970;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [32];
  undefined1 local_860 [16];
  undefined1 local_850 [16];
  undefined1 local_840 [16];
  undefined1 (*local_828) [32];
  undefined1 local_820 [32];
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  Primitive *local_690;
  ulong local_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  undefined1 auStack_610 [16];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_530 [16];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  RTCHitN local_4a0 [32];
  undefined1 local_480 [32];
  undefined4 local_460;
  undefined4 uStack_45c;
  undefined4 uStack_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  
  PVar1 = prim[1];
  uVar73 = (ulong)(byte)PVar1;
  fVar252 = *(float *)(prim + uVar73 * 0x19 + 0x12);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar88 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar89 = vsubps_avx(auVar15,*(undefined1 (*) [16])(prim + uVar73 * 0x19 + 6));
  fVar214 = fVar252 * auVar89._0_4_;
  fVar154 = fVar252 * auVar88._0_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar73 * 4 + 6);
  auVar102 = vpmovsxbd_avx2(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar73 * 5 + 6);
  auVar100 = vpmovsxbd_avx2(auVar16);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar73 * 6 + 6);
  auVar103 = vpmovsxbd_avx2(auVar86);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar73 * 0xb + 6);
  auVar104 = vpmovsxbd_avx2(auVar91);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6);
  auVar109 = vpmovsxbd_avx2(auVar84);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar105 = vcvtdq2ps_avx(auVar109);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + (uint)(byte)PVar1 * 0xc + uVar73 + 6);
  auVar101 = vpmovsxbd_avx2(auVar96);
  auVar101 = vcvtdq2ps_avx(auVar101);
  uVar76 = (ulong)(uint)((int)(uVar73 * 9) * 2);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar76 + 6);
  auVar106 = vpmovsxbd_avx2(auVar92);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar76 + uVar73 + 6);
  auVar107 = vpmovsxbd_avx2(auVar85);
  auVar107 = vcvtdq2ps_avx(auVar107);
  uVar78 = (ulong)(uint)((int)(uVar73 * 5) << 2);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar78 + 6);
  auVar99 = vpmovsxbd_avx2(auVar87);
  auVar108 = vcvtdq2ps_avx(auVar99);
  auVar119._4_4_ = fVar154;
  auVar119._0_4_ = fVar154;
  auVar119._8_4_ = fVar154;
  auVar119._12_4_ = fVar154;
  auVar119._16_4_ = fVar154;
  auVar119._20_4_ = fVar154;
  auVar119._24_4_ = fVar154;
  auVar119._28_4_ = fVar154;
  auVar121._8_4_ = 1;
  auVar121._0_8_ = 0x100000001;
  auVar121._12_4_ = 1;
  auVar121._16_4_ = 1;
  auVar121._20_4_ = 1;
  auVar121._24_4_ = 1;
  auVar121._28_4_ = 1;
  auVar97 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar111 = ZEXT1632(CONCAT412(fVar252 * auVar88._12_4_,
                                CONCAT48(fVar252 * auVar88._8_4_,
                                         CONCAT44(fVar252 * auVar88._4_4_,fVar154))));
  auVar110 = vpermps_avx2(auVar121,auVar111);
  auVar98 = vpermps_avx512vl(auVar97,auVar111);
  fVar154 = auVar98._0_4_;
  fVar257 = auVar98._4_4_;
  auVar111._4_4_ = fVar257 * auVar103._4_4_;
  auVar111._0_4_ = fVar154 * auVar103._0_4_;
  fVar258 = auVar98._8_4_;
  auVar111._8_4_ = fVar258 * auVar103._8_4_;
  fVar259 = auVar98._12_4_;
  auVar111._12_4_ = fVar259 * auVar103._12_4_;
  fVar230 = auVar98._16_4_;
  auVar111._16_4_ = fVar230 * auVar103._16_4_;
  fVar231 = auVar98._20_4_;
  auVar111._20_4_ = fVar231 * auVar103._20_4_;
  fVar232 = auVar98._24_4_;
  auVar111._24_4_ = fVar232 * auVar103._24_4_;
  auVar111._28_4_ = auVar109._28_4_;
  auVar109._4_4_ = auVar101._4_4_ * fVar257;
  auVar109._0_4_ = auVar101._0_4_ * fVar154;
  auVar109._8_4_ = auVar101._8_4_ * fVar258;
  auVar109._12_4_ = auVar101._12_4_ * fVar259;
  auVar109._16_4_ = auVar101._16_4_ * fVar230;
  auVar109._20_4_ = auVar101._20_4_ * fVar231;
  auVar109._24_4_ = auVar101._24_4_ * fVar232;
  auVar109._28_4_ = auVar99._28_4_;
  auVar99._4_4_ = auVar108._4_4_ * fVar257;
  auVar99._0_4_ = auVar108._0_4_ * fVar154;
  auVar99._8_4_ = auVar108._8_4_ * fVar258;
  auVar99._12_4_ = auVar108._12_4_ * fVar259;
  auVar99._16_4_ = auVar108._16_4_ * fVar230;
  auVar99._20_4_ = auVar108._20_4_ * fVar231;
  auVar99._24_4_ = auVar108._24_4_ * fVar232;
  auVar99._28_4_ = auVar98._28_4_;
  auVar15 = vfmadd231ps_fma(auVar111,auVar110,auVar100);
  auVar16 = vfmadd231ps_fma(auVar109,auVar110,auVar105);
  auVar86 = vfmadd231ps_fma(auVar99,auVar107,auVar110);
  auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar119,auVar102);
  auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar119,auVar104);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar106,auVar119);
  auVar120._4_4_ = fVar214;
  auVar120._0_4_ = fVar214;
  auVar120._8_4_ = fVar214;
  auVar120._12_4_ = fVar214;
  auVar120._16_4_ = fVar214;
  auVar120._20_4_ = fVar214;
  auVar120._24_4_ = fVar214;
  auVar120._28_4_ = fVar214;
  auVar99 = ZEXT1632(CONCAT412(fVar252 * auVar89._12_4_,
                               CONCAT48(fVar252 * auVar89._8_4_,
                                        CONCAT44(fVar252 * auVar89._4_4_,fVar214))));
  auVar109 = vpermps_avx2(auVar121,auVar99);
  auVar99 = vpermps_avx512vl(auVar97,auVar99);
  fVar252 = auVar99._0_4_;
  fVar154 = auVar99._4_4_;
  auVar110._4_4_ = fVar154 * auVar103._4_4_;
  auVar110._0_4_ = fVar252 * auVar103._0_4_;
  fVar257 = auVar99._8_4_;
  auVar110._8_4_ = fVar257 * auVar103._8_4_;
  fVar258 = auVar99._12_4_;
  auVar110._12_4_ = fVar258 * auVar103._12_4_;
  fVar259 = auVar99._16_4_;
  auVar110._16_4_ = fVar259 * auVar103._16_4_;
  fVar230 = auVar99._20_4_;
  auVar110._20_4_ = fVar230 * auVar103._20_4_;
  fVar231 = auVar99._24_4_;
  auVar110._24_4_ = fVar231 * auVar103._24_4_;
  auVar110._28_4_ = 1;
  auVar97._4_4_ = auVar101._4_4_ * fVar154;
  auVar97._0_4_ = auVar101._0_4_ * fVar252;
  auVar97._8_4_ = auVar101._8_4_ * fVar257;
  auVar97._12_4_ = auVar101._12_4_ * fVar258;
  auVar97._16_4_ = auVar101._16_4_ * fVar259;
  auVar97._20_4_ = auVar101._20_4_ * fVar230;
  auVar97._24_4_ = auVar101._24_4_ * fVar231;
  auVar97._28_4_ = auVar103._28_4_;
  auVar101._4_4_ = auVar108._4_4_ * fVar154;
  auVar101._0_4_ = auVar108._0_4_ * fVar252;
  auVar101._8_4_ = auVar108._8_4_ * fVar257;
  auVar101._12_4_ = auVar108._12_4_ * fVar258;
  auVar101._16_4_ = auVar108._16_4_ * fVar259;
  auVar101._20_4_ = auVar108._20_4_ * fVar230;
  auVar101._24_4_ = auVar108._24_4_ * fVar231;
  auVar101._28_4_ = auVar99._28_4_;
  auVar91 = vfmadd231ps_fma(auVar110,auVar109,auVar100);
  auVar84 = vfmadd231ps_fma(auVar97,auVar109,auVar105);
  auVar96 = vfmadd231ps_fma(auVar101,auVar109,auVar107);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar120,auVar102);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar120,auVar104);
  auVar116._8_4_ = 0x7fffffff;
  auVar116._0_8_ = 0x7fffffff7fffffff;
  auVar116._12_4_ = 0x7fffffff;
  auVar116._16_4_ = 0x7fffffff;
  auVar116._20_4_ = 0x7fffffff;
  auVar116._24_4_ = 0x7fffffff;
  auVar116._28_4_ = 0x7fffffff;
  auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar120,auVar106);
  auVar102 = vandps_avx(ZEXT1632(auVar15),auVar116);
  auVar118._8_4_ = 0x219392ef;
  auVar118._0_8_ = 0x219392ef219392ef;
  auVar118._12_4_ = 0x219392ef;
  auVar118._16_4_ = 0x219392ef;
  auVar118._20_4_ = 0x219392ef;
  auVar118._24_4_ = 0x219392ef;
  auVar118._28_4_ = 0x219392ef;
  uVar76 = vcmpps_avx512vl(auVar102,auVar118,1);
  bVar7 = (bool)((byte)uVar76 & 1);
  auVar98._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar15._0_4_;
  bVar7 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar15._4_4_;
  bVar7 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar15._8_4_;
  bVar7 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar15._12_4_;
  auVar98._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar98._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar98._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar98._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar102 = vandps_avx(ZEXT1632(auVar16),auVar116);
  uVar76 = vcmpps_avx512vl(auVar102,auVar118,1);
  bVar7 = (bool)((byte)uVar76 & 1);
  auVar112._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar16._0_4_;
  bVar7 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar112._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar16._4_4_;
  bVar7 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar112._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar16._8_4_;
  bVar7 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar112._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar16._12_4_;
  auVar112._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar112._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar112._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar112._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar102 = vandps_avx(ZEXT1632(auVar86),auVar116);
  uVar76 = vcmpps_avx512vl(auVar102,auVar118,1);
  bVar7 = (bool)((byte)uVar76 & 1);
  auVar102._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar86._0_4_;
  bVar7 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar102._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar86._4_4_;
  bVar7 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar102._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar86._8_4_;
  bVar7 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar102._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar86._12_4_;
  auVar102._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar102._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar102._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar102._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar100 = vrcp14ps_avx512vl(auVar98);
  auVar117._8_4_ = 0x3f800000;
  auVar117._0_8_ = 0x3f8000003f800000;
  auVar117._12_4_ = 0x3f800000;
  auVar117._16_4_ = 0x3f800000;
  auVar117._20_4_ = 0x3f800000;
  auVar117._24_4_ = 0x3f800000;
  auVar117._28_4_ = 0x3f800000;
  auVar15 = vfnmadd213ps_fma(auVar98,auVar100,auVar117);
  auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar100,auVar100);
  auVar100 = vrcp14ps_avx512vl(auVar112);
  auVar16 = vfnmadd213ps_fma(auVar112,auVar100,auVar117);
  auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar100,auVar100);
  auVar100 = vrcp14ps_avx512vl(auVar102);
  auVar86 = vfnmadd213ps_fma(auVar102,auVar100,auVar117);
  auVar86 = vfmadd132ps_fma(ZEXT1632(auVar86),auVar100,auVar100);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 7 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar91));
  auVar106._4_4_ = auVar15._4_4_ * auVar102._4_4_;
  auVar106._0_4_ = auVar15._0_4_ * auVar102._0_4_;
  auVar106._8_4_ = auVar15._8_4_ * auVar102._8_4_;
  auVar106._12_4_ = auVar15._12_4_ * auVar102._12_4_;
  auVar106._16_4_ = auVar102._16_4_ * 0.0;
  auVar106._20_4_ = auVar102._20_4_ * 0.0;
  auVar106._24_4_ = auVar102._24_4_ * 0.0;
  auVar106._28_4_ = auVar102._28_4_;
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 9 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar91));
  auVar101 = vpbroadcastd_avx512vl();
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar1 * 0x10 + 6));
  auVar115._0_4_ = auVar15._0_4_ * auVar102._0_4_;
  auVar115._4_4_ = auVar15._4_4_ * auVar102._4_4_;
  auVar115._8_4_ = auVar15._8_4_ * auVar102._8_4_;
  auVar115._12_4_ = auVar15._12_4_ * auVar102._12_4_;
  auVar115._16_4_ = auVar102._16_4_ * 0.0;
  auVar115._20_4_ = auVar102._20_4_ * 0.0;
  auVar115._24_4_ = auVar102._24_4_ * 0.0;
  auVar115._28_4_ = 0;
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar1 * 0x10 + uVar73 * -2 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar84));
  auVar107._4_4_ = auVar16._4_4_ * auVar102._4_4_;
  auVar107._0_4_ = auVar16._0_4_ * auVar102._0_4_;
  auVar107._8_4_ = auVar16._8_4_ * auVar102._8_4_;
  auVar107._12_4_ = auVar16._12_4_ * auVar102._12_4_;
  auVar107._16_4_ = auVar102._16_4_ * 0.0;
  auVar107._20_4_ = auVar102._20_4_ * 0.0;
  auVar107._24_4_ = auVar102._24_4_ * 0.0;
  auVar107._28_4_ = auVar102._28_4_;
  auVar102 = vcvtdq2ps_avx(auVar100);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar84));
  auVar114._0_4_ = auVar16._0_4_ * auVar102._0_4_;
  auVar114._4_4_ = auVar16._4_4_ * auVar102._4_4_;
  auVar114._8_4_ = auVar16._8_4_ * auVar102._8_4_;
  auVar114._12_4_ = auVar16._12_4_ * auVar102._12_4_;
  auVar114._16_4_ = auVar102._16_4_ * 0.0;
  auVar114._20_4_ = auVar102._20_4_ * 0.0;
  auVar114._24_4_ = auVar102._24_4_ * 0.0;
  auVar114._28_4_ = 0;
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 + uVar73 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar96));
  auVar108._4_4_ = auVar102._4_4_ * auVar86._4_4_;
  auVar108._0_4_ = auVar102._0_4_ * auVar86._0_4_;
  auVar108._8_4_ = auVar102._8_4_ * auVar86._8_4_;
  auVar108._12_4_ = auVar102._12_4_ * auVar86._12_4_;
  auVar108._16_4_ = auVar102._16_4_ * 0.0;
  auVar108._20_4_ = auVar102._20_4_ * 0.0;
  auVar108._24_4_ = auVar102._24_4_ * 0.0;
  auVar108._28_4_ = auVar102._28_4_;
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 0x17 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar96));
  auVar113._0_4_ = auVar86._0_4_ * auVar102._0_4_;
  auVar113._4_4_ = auVar86._4_4_ * auVar102._4_4_;
  auVar113._8_4_ = auVar86._8_4_ * auVar102._8_4_;
  auVar113._12_4_ = auVar86._12_4_ * auVar102._12_4_;
  auVar113._16_4_ = auVar102._16_4_ * 0.0;
  auVar113._20_4_ = auVar102._20_4_ * 0.0;
  auVar113._24_4_ = auVar102._24_4_ * 0.0;
  auVar113._28_4_ = 0;
  auVar102 = vpminsd_avx2(auVar106,auVar115);
  auVar100 = vpminsd_avx2(auVar107,auVar114);
  auVar102 = vmaxps_avx(auVar102,auVar100);
  auVar100 = vpminsd_avx2(auVar108,auVar113);
  uVar177 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar103._4_4_ = uVar177;
  auVar103._0_4_ = uVar177;
  auVar103._8_4_ = uVar177;
  auVar103._12_4_ = uVar177;
  auVar103._16_4_ = uVar177;
  auVar103._20_4_ = uVar177;
  auVar103._24_4_ = uVar177;
  auVar103._28_4_ = uVar177;
  auVar100 = vmaxps_avx512vl(auVar100,auVar103);
  auVar102 = vmaxps_avx(auVar102,auVar100);
  auVar100._8_4_ = 0x3f7ffffa;
  auVar100._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar100._12_4_ = 0x3f7ffffa;
  auVar100._16_4_ = 0x3f7ffffa;
  auVar100._20_4_ = 0x3f7ffffa;
  auVar100._24_4_ = 0x3f7ffffa;
  auVar100._28_4_ = 0x3f7ffffa;
  local_300 = vmulps_avx512vl(auVar102,auVar100);
  auVar102 = vpmaxsd_avx2(auVar106,auVar115);
  auVar100 = vpmaxsd_avx2(auVar107,auVar114);
  auVar102 = vminps_avx(auVar102,auVar100);
  auVar100 = vpmaxsd_avx2(auVar108,auVar113);
  uVar177 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar104._4_4_ = uVar177;
  auVar104._0_4_ = uVar177;
  auVar104._8_4_ = uVar177;
  auVar104._12_4_ = uVar177;
  auVar104._16_4_ = uVar177;
  auVar104._20_4_ = uVar177;
  auVar104._24_4_ = uVar177;
  auVar104._28_4_ = uVar177;
  auVar100 = vminps_avx512vl(auVar100,auVar104);
  auVar102 = vminps_avx(auVar102,auVar100);
  auVar105._8_4_ = 0x3f800003;
  auVar105._0_8_ = 0x3f8000033f800003;
  auVar105._12_4_ = 0x3f800003;
  auVar105._16_4_ = 0x3f800003;
  auVar105._20_4_ = 0x3f800003;
  auVar105._24_4_ = 0x3f800003;
  auVar105._28_4_ = 0x3f800003;
  auVar102 = vmulps_avx512vl(auVar102,auVar105);
  uVar18 = vpcmpgtd_avx512vl(auVar101,_DAT_01fe9900);
  uVar17 = vcmpps_avx512vl(local_300,auVar102,2);
  if ((byte)((byte)uVar17 & (byte)uVar18) == 0) {
    return;
  }
  local_688 = (ulong)(byte)((byte)uVar17 & (byte)uVar18);
  local_828 = (undefined1 (*) [32])&local_3c0;
  local_520 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_690 = prim;
LAB_01d705c1:
  lVar80 = 0;
  for (uVar76 = local_688; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
    lVar80 = lVar80 + 1;
  }
  uVar79 = *(uint *)(prim + 2);
  uVar2 = *(uint *)(prim + lVar80 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar79].ptr;
  uVar76 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar2);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar80 = *(long *)&pGVar4[1].time_range.upper;
  auVar15 = *(undefined1 (*) [16])(lVar80 + (long)p_Var5 * uVar76);
  auVar16 = *(undefined1 (*) [16])(lVar80 + (uVar76 + 1) * (long)p_Var5);
  auVar86 = *(undefined1 (*) [16])(lVar80 + (uVar76 + 2) * (long)p_Var5);
  local_688 = local_688 - 1 & local_688;
  auVar91 = *(undefined1 (*) [16])(lVar80 + (uVar76 + 3) * (long)p_Var5);
  if (local_688 != 0) {
    uVar78 = local_688 - 1 & local_688;
    for (uVar76 = local_688; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
    }
    if (uVar78 != 0) {
      for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar96 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar177 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar90._4_4_ = uVar177;
  auVar90._0_4_ = uVar177;
  auVar90._8_4_ = uVar177;
  auVar90._12_4_ = uVar177;
  local_5a0._16_4_ = uVar177;
  local_5a0._0_16_ = auVar90;
  local_5a0._20_4_ = uVar177;
  local_5a0._24_4_ = uVar177;
  local_5a0._28_4_ = uVar177;
  auVar268 = ZEXT3264(local_5a0);
  uVar177 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar95._4_4_ = uVar177;
  auVar95._0_4_ = uVar177;
  auVar95._8_4_ = uVar177;
  auVar95._12_4_ = uVar177;
  local_5c0._16_4_ = uVar177;
  local_5c0._0_16_ = auVar95;
  local_5c0._20_4_ = uVar177;
  local_5c0._24_4_ = uVar177;
  local_5c0._28_4_ = uVar177;
  auVar84 = vunpcklps_avx(auVar90,auVar95);
  fVar252 = *(float *)(ray + k * 4 + 0xc0);
  auVar260._4_4_ = fVar252;
  auVar260._0_4_ = fVar252;
  auVar260._8_4_ = fVar252;
  auVar260._12_4_ = fVar252;
  local_5e0._16_4_ = fVar252;
  local_5e0._0_16_ = auVar260;
  local_5e0._20_4_ = fVar252;
  local_5e0._24_4_ = fVar252;
  local_5e0._28_4_ = fVar252;
  local_7f0 = vinsertps_avx(auVar84,auVar260,0x28);
  auVar261 = ZEXT1664(local_7f0);
  auVar89._0_4_ = auVar15._0_4_ + auVar16._0_4_ + auVar86._0_4_ + auVar91._0_4_;
  auVar89._4_4_ = auVar15._4_4_ + auVar16._4_4_ + auVar86._4_4_ + auVar91._4_4_;
  auVar89._8_4_ = auVar15._8_4_ + auVar16._8_4_ + auVar86._8_4_ + auVar91._8_4_;
  auVar89._12_4_ = auVar15._12_4_ + auVar16._12_4_ + auVar86._12_4_ + auVar91._12_4_;
  auVar88._8_4_ = 0x3e800000;
  auVar88._0_8_ = 0x3e8000003e800000;
  auVar88._12_4_ = 0x3e800000;
  auVar84 = vmulps_avx512vl(auVar89,auVar88);
  auVar84 = vsubps_avx(auVar84,auVar96);
  auVar84 = vdpps_avx(auVar84,local_7f0,0x7f);
  fVar154 = *(float *)(ray + k * 4 + 0x60);
  auVar263 = ZEXT464((uint)fVar154);
  local_800 = vdpps_avx(local_7f0,local_7f0,0x7f);
  auVar265 = ZEXT1664(local_800);
  auVar93._4_12_ = ZEXT812(0) << 0x20;
  auVar93._0_4_ = local_800._0_4_;
  auVar85 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar93);
  auVar92 = vfnmadd213ss_fma(auVar85,local_800,ZEXT416(0x40000000));
  local_2e0 = auVar84._0_4_ * auVar85._0_4_ * auVar92._0_4_;
  auVar245 = ZEXT464((uint)local_2e0);
  auVar94._4_4_ = local_2e0;
  auVar94._0_4_ = local_2e0;
  auVar94._8_4_ = local_2e0;
  auVar94._12_4_ = local_2e0;
  fStack_7d0 = local_2e0;
  _local_7e0 = auVar94;
  fStack_7cc = local_2e0;
  fStack_7c8 = local_2e0;
  fStack_7c4 = local_2e0;
  auVar84 = vfmadd231ps_fma(auVar96,local_7f0,auVar94);
  auVar84 = vblendps_avx(auVar84,ZEXT816(0) << 0x40,8);
  auVar15 = vsubps_avx(auVar15,auVar84);
  auVar86 = vsubps_avx(auVar86,auVar84);
  auVar251 = ZEXT1664(auVar86);
  auVar16 = vsubps_avx(auVar16,auVar84);
  auVar256 = ZEXT1664(auVar16);
  auVar91 = vsubps_avx(auVar91,auVar84);
  auVar102 = vbroadcastss_avx512vl(auVar15);
  auVar123._8_4_ = 1;
  auVar123._0_8_ = 0x100000001;
  auVar123._12_4_ = 1;
  auVar123._16_4_ = 1;
  auVar123._20_4_ = 1;
  auVar123._24_4_ = 1;
  auVar123._28_4_ = 1;
  local_760 = ZEXT1632(auVar15);
  auVar100 = vpermps_avx512vl(auVar123,local_760);
  auVar124._8_4_ = 2;
  auVar124._0_8_ = 0x200000002;
  auVar124._12_4_ = 2;
  auVar124._16_4_ = 2;
  auVar124._20_4_ = 2;
  auVar124._24_4_ = 2;
  auVar124._28_4_ = 2;
  auVar103 = vpermps_avx512vl(auVar124,local_760);
  auVar125._8_4_ = 3;
  auVar125._0_8_ = 0x300000003;
  auVar125._12_4_ = 3;
  auVar125._16_4_ = 3;
  auVar125._20_4_ = 3;
  auVar125._24_4_ = 3;
  auVar125._28_4_ = 3;
  local_8e0 = vpermps_avx512vl(auVar125,local_760);
  auVar270 = ZEXT3264(local_8e0);
  auVar104 = vbroadcastss_avx512vl(auVar16);
  local_7a0 = ZEXT1632(auVar16);
  auVar105 = vpermps_avx512vl(auVar123,local_7a0);
  local_900 = vpermps_avx512vl(auVar124,local_7a0);
  auVar271 = ZEXT3264(local_900);
  auVar101 = vpermps_avx512vl(auVar125,local_7a0);
  local_920 = vbroadcastss_avx512vl(auVar86);
  auVar272 = ZEXT3264(local_920);
  local_780 = ZEXT1632(auVar86);
  auVar106 = vpermps_avx512vl(auVar123,local_780);
  local_940 = vpermps_avx512vl(auVar124,local_780);
  auVar273 = ZEXT3264(local_940);
  auVar107 = vpermps_avx512vl(auVar125,local_780);
  local_260 = vbroadcastss_avx512vl(auVar91);
  _local_7c0 = ZEXT1632(auVar91);
  local_280 = vpermps_avx2(auVar123,_local_7c0);
  local_240 = vpermps_avx512vl(auVar124,_local_7c0);
  local_2c0 = vpermps_avx2(auVar125,_local_7c0);
  auVar15 = vfmadd231ps_fma(ZEXT432((uint)(fVar252 * fVar252)),local_5c0,local_5c0);
  auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),local_5a0,local_5a0);
  local_220._0_4_ = auVar15._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar122._8_4_ = 0x7fffffff;
  auVar122._0_8_ = 0x7fffffff7fffffff;
  auVar122._12_4_ = 0x7fffffff;
  auVar122._16_4_ = 0x7fffffff;
  auVar122._20_4_ = 0x7fffffff;
  auVar122._24_4_ = 0x7fffffff;
  auVar122._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar122);
  local_6f0 = ZEXT416((uint)local_2e0);
  local_2e0 = fVar154 - local_2e0;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_4c0 = vpbroadcastd_avx512vl();
  iVar77 = 1;
  uVar76 = 0;
  local_4e0 = vpbroadcastd_avx512vl();
  auVar15 = vsqrtss_avx(local_800,local_800);
  auVar16 = vsqrtss_avx(local_800,local_800);
  local_530 = ZEXT816(0x3f80000000000000);
  auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar274 = ZEXT3264(auVar108);
  local_2a0 = local_240;
  do {
    auVar86 = vmovshdup_avx(local_530);
    auVar86 = vsubps_avx(auVar86,local_530);
    auVar162._0_4_ = auVar86._0_4_;
    fVar242 = auVar162._0_4_ * 0.04761905;
    uVar177 = local_530._0_4_;
    local_880._4_4_ = uVar177;
    local_880._0_4_ = uVar177;
    local_880._8_4_ = uVar177;
    local_880._12_4_ = uVar177;
    local_880._16_4_ = uVar177;
    local_880._20_4_ = uVar177;
    local_880._24_4_ = uVar177;
    local_880._28_4_ = uVar177;
    auVar162._4_4_ = auVar162._0_4_;
    auVar162._8_4_ = auVar162._0_4_;
    auVar162._12_4_ = auVar162._0_4_;
    auVar162._16_4_ = auVar162._0_4_;
    auVar162._20_4_ = auVar162._0_4_;
    auVar162._24_4_ = auVar162._0_4_;
    auVar162._28_4_ = auVar162._0_4_;
    auVar86 = vfmadd231ps_fma(local_880,auVar162,_DAT_01faff20);
    auVar109 = vsubps_avx512vl(auVar274._0_32_,ZEXT1632(auVar86));
    fVar252 = auVar109._0_4_;
    fVar258 = auVar109._4_4_;
    fVar230 = auVar109._8_4_;
    fVar232 = auVar109._12_4_;
    fVar233 = auVar109._16_4_;
    fVar240 = auVar109._20_4_;
    fVar241 = auVar109._24_4_;
    fVar155 = fVar252 * fVar252 * fVar252;
    fVar171 = fVar258 * fVar258 * fVar258;
    auVar131._4_4_ = fVar171;
    auVar131._0_4_ = fVar155;
    fVar172 = fVar230 * fVar230 * fVar230;
    auVar131._8_4_ = fVar172;
    fVar173 = fVar232 * fVar232 * fVar232;
    auVar131._12_4_ = fVar173;
    fVar174 = fVar233 * fVar233 * fVar233;
    auVar131._16_4_ = fVar174;
    fVar175 = fVar240 * fVar240 * fVar240;
    auVar131._20_4_ = fVar175;
    fVar176 = fVar241 * fVar241 * fVar241;
    auVar131._24_4_ = fVar176;
    auVar131._28_4_ = auVar162._0_4_;
    auVar108 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar99 = vmulps_avx512vl(auVar131,auVar108);
    fVar257 = auVar86._0_4_;
    fVar259 = auVar86._4_4_;
    fVar231 = auVar86._8_4_;
    fVar214 = auVar86._12_4_;
    fVar193 = fVar257 * fVar257 * fVar257;
    fVar211 = fVar259 * fVar259 * fVar259;
    fVar212 = fVar231 * fVar231 * fVar231;
    fVar213 = fVar214 * fVar214 * fVar214;
    auVar69._28_4_ = DAT_01faff20._28_4_;
    auVar69._0_28_ = ZEXT1628(CONCAT412(fVar213,CONCAT48(fVar212,CONCAT44(fVar211,fVar193))));
    auVar262._0_4_ = fVar257 * fVar252;
    auVar262._4_4_ = fVar259 * fVar258;
    auVar262._8_4_ = fVar231 * fVar230;
    auVar262._12_4_ = fVar214 * fVar232;
    auVar262._16_4_ = fVar233 * 0.0;
    auVar262._20_4_ = fVar240 * 0.0;
    auVar262._28_36_ = auVar261._28_36_;
    auVar262._24_4_ = fVar241 * 0.0;
    auVar110 = vmulps_avx512vl(auVar69,auVar108);
    fVar264 = auVar110._28_4_ + auVar162._0_4_;
    fVar246 = fVar264 + auVar265._28_4_ + auVar245._28_4_;
    auVar134._4_4_ = fVar171 * 0.16666667;
    auVar134._0_4_ = fVar155 * 0.16666667;
    auVar134._8_4_ = fVar172 * 0.16666667;
    auVar134._12_4_ = fVar173 * 0.16666667;
    auVar134._16_4_ = fVar174 * 0.16666667;
    auVar134._20_4_ = fVar175 * 0.16666667;
    auVar134._24_4_ = fVar176 * 0.16666667;
    auVar134._28_4_ = fVar264;
    auVar135._4_4_ =
         (auVar262._4_4_ * fVar258 * 12.0 + auVar262._4_4_ * fVar259 * 6.0 + fVar211 + auVar99._4_4_
         ) * 0.16666667;
    auVar135._0_4_ =
         (auVar262._0_4_ * fVar252 * 12.0 + auVar262._0_4_ * fVar257 * 6.0 + fVar193 + auVar99._0_4_
         ) * 0.16666667;
    auVar135._8_4_ =
         (auVar262._8_4_ * fVar230 * 12.0 + auVar262._8_4_ * fVar231 * 6.0 + fVar212 + auVar99._8_4_
         ) * 0.16666667;
    auVar135._12_4_ =
         (auVar262._12_4_ * fVar232 * 12.0 + auVar262._12_4_ * fVar214 * 6.0 +
         fVar213 + auVar99._12_4_) * 0.16666667;
    auVar135._16_4_ =
         (auVar262._16_4_ * fVar233 * 12.0 + auVar262._16_4_ * 0.0 * 6.0 + auVar99._16_4_ + 0.0) *
         0.16666667;
    auVar135._20_4_ =
         (auVar262._20_4_ * fVar240 * 12.0 + auVar262._20_4_ * 0.0 * 6.0 + auVar99._20_4_ + 0.0) *
         0.16666667;
    auVar135._24_4_ =
         (auVar262._24_4_ * fVar241 * 12.0 + auVar262._24_4_ * 0.0 * 6.0 + auVar99._24_4_ + 0.0) *
         0.16666667;
    auVar135._28_4_ = auVar265._28_4_;
    auVar227._4_4_ =
         (auVar110._4_4_ + fVar171 +
         auVar262._4_4_ * fVar259 * 12.0 + auVar262._4_4_ * fVar258 * 6.0) * 0.16666667;
    auVar227._0_4_ =
         (auVar110._0_4_ + fVar155 +
         auVar262._0_4_ * fVar257 * 12.0 + auVar262._0_4_ * fVar252 * 6.0) * 0.16666667;
    auVar227._8_4_ =
         (auVar110._8_4_ + fVar172 +
         auVar262._8_4_ * fVar231 * 12.0 + auVar262._8_4_ * fVar230 * 6.0) * 0.16666667;
    auVar227._12_4_ =
         (auVar110._12_4_ + fVar173 +
         auVar262._12_4_ * fVar214 * 12.0 + auVar262._12_4_ * fVar232 * 6.0) * 0.16666667;
    auVar227._16_4_ =
         (auVar110._16_4_ + fVar174 + auVar262._16_4_ * 0.0 * 12.0 + auVar262._16_4_ * fVar233 * 6.0
         ) * 0.16666667;
    auVar227._20_4_ =
         (auVar110._20_4_ + fVar175 + auVar262._20_4_ * 0.0 * 12.0 + auVar262._20_4_ * fVar240 * 6.0
         ) * 0.16666667;
    auVar227._24_4_ =
         (auVar110._24_4_ + fVar176 + auVar262._24_4_ * 0.0 * 12.0 + auVar262._24_4_ * fVar241 * 6.0
         ) * 0.16666667;
    auVar227._28_4_ = auVar268._28_4_;
    fVar193 = fVar193 * 0.16666667;
    fVar211 = fVar211 * 0.16666667;
    fVar212 = fVar212 * 0.16666667;
    fVar213 = fVar213 * 0.16666667;
    auVar33._28_4_ = fVar246;
    auVar33._0_28_ = ZEXT1628(CONCAT412(fVar213,CONCAT48(fVar212,CONCAT44(fVar211,fVar193))));
    auVar110 = vmulps_avx512vl(local_260,auVar33);
    auVar34._4_4_ = local_280._4_4_ * fVar211;
    auVar34._0_4_ = local_280._0_4_ * fVar193;
    auVar34._8_4_ = local_280._8_4_ * fVar212;
    auVar34._12_4_ = local_280._12_4_ * fVar213;
    auVar34._16_4_ = local_280._16_4_ * 0.0;
    auVar34._20_4_ = local_280._20_4_ * 0.0;
    auVar34._24_4_ = local_280._24_4_ * 0.0;
    auVar34._28_4_ = auVar263._28_4_ + auVar268._28_4_ + DAT_01faff20._28_4_ + auVar99._28_4_;
    auVar99 = vmulps_avx512vl(local_2a0,auVar33);
    auVar35._4_4_ = local_2c0._4_4_ * fVar211;
    auVar35._0_4_ = local_2c0._0_4_ * fVar193;
    auVar35._8_4_ = local_2c0._8_4_ * fVar212;
    auVar35._12_4_ = local_2c0._12_4_ * fVar213;
    auVar35._16_4_ = local_2c0._16_4_ * 0.0;
    auVar35._20_4_ = local_2c0._20_4_ * 0.0;
    auVar35._24_4_ = local_2c0._24_4_ * 0.0;
    auVar35._28_4_ = fVar246;
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar227,auVar272._0_32_);
    auVar111 = vfmadd231ps_avx512vl(auVar34,auVar227,auVar106);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar227,auVar273._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar35,auVar107,auVar227);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar135,auVar104);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar135,auVar105);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar135,auVar271._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar101,auVar135);
    auVar98 = vfmadd231ps_avx512vl(auVar110,auVar134,auVar102);
    auVar112 = vfmadd231ps_avx512vl(auVar111,auVar134,auVar100);
    auVar113 = vfmadd231ps_avx512vl(auVar99,auVar134,auVar103);
    auVar99 = vfmadd231ps_avx512vl(auVar97,auVar270._0_32_,auVar134);
    auVar97 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar110 = vxorps_avx512vl(auVar109,auVar97);
    auVar111 = vxorps_avx512vl(ZEXT1632(auVar86),auVar97);
    auVar236._0_4_ = auVar111._0_4_ * fVar257;
    auVar236._4_4_ = auVar111._4_4_ * fVar259;
    auVar236._8_4_ = auVar111._8_4_ * fVar231;
    auVar236._12_4_ = auVar111._12_4_ * fVar214;
    auVar236._16_4_ = auVar111._16_4_ * 0.0;
    auVar236._20_4_ = auVar111._20_4_ * 0.0;
    auVar236._24_4_ = auVar111._24_4_ * 0.0;
    auVar236._28_4_ = 0;
    auVar114 = vmulps_avx512vl(auVar262._0_32_,auVar108);
    auVar108 = vsubps_avx(auVar236,auVar114);
    auVar36._4_4_ = auVar110._4_4_ * fVar258 * 0.5;
    auVar36._0_4_ = auVar110._0_4_ * fVar252 * 0.5;
    auVar36._8_4_ = auVar110._8_4_ * fVar230 * 0.5;
    auVar36._12_4_ = auVar110._12_4_ * fVar232 * 0.5;
    auVar36._16_4_ = auVar110._16_4_ * fVar233 * 0.5;
    auVar36._20_4_ = auVar110._20_4_ * fVar240 * 0.5;
    auVar36._24_4_ = auVar110._24_4_ * fVar241 * 0.5;
    auVar36._28_4_ = auVar109._28_4_;
    auVar37._4_4_ = auVar108._4_4_ * 0.5;
    auVar37._0_4_ = auVar108._0_4_ * 0.5;
    auVar37._8_4_ = auVar108._8_4_ * 0.5;
    auVar37._12_4_ = auVar108._12_4_ * 0.5;
    auVar37._16_4_ = auVar108._16_4_ * 0.5;
    auVar37._20_4_ = auVar108._20_4_ * 0.5;
    auVar37._24_4_ = auVar108._24_4_ * 0.5;
    auVar37._28_4_ = auVar108._28_4_;
    auVar38._4_4_ = (auVar114._4_4_ + fVar258 * fVar258) * 0.5;
    auVar38._0_4_ = (auVar114._0_4_ + fVar252 * fVar252) * 0.5;
    auVar38._8_4_ = (auVar114._8_4_ + fVar230 * fVar230) * 0.5;
    auVar38._12_4_ = (auVar114._12_4_ + fVar232 * fVar232) * 0.5;
    auVar38._16_4_ = (auVar114._16_4_ + fVar233 * fVar233) * 0.5;
    auVar38._20_4_ = (auVar114._20_4_ + fVar240 * fVar240) * 0.5;
    auVar38._24_4_ = (auVar114._24_4_ + fVar241 * fVar241) * 0.5;
    auVar38._28_4_ = auVar114._28_4_ + auVar251._28_4_;
    fVar252 = fVar257 * fVar257 * 0.5;
    fVar257 = fVar259 * fVar259 * 0.5;
    fVar258 = fVar231 * fVar231 * 0.5;
    fVar259 = fVar214 * fVar214 * 0.5;
    auVar39._28_4_ = auVar256._28_4_;
    auVar39._0_28_ = ZEXT1628(CONCAT412(fVar259,CONCAT48(fVar258,CONCAT44(fVar257,fVar252))));
    auVar108 = vmulps_avx512vl(local_260,auVar39);
    auVar40._4_4_ = local_280._4_4_ * fVar257;
    auVar40._0_4_ = local_280._0_4_ * fVar252;
    auVar40._8_4_ = local_280._8_4_ * fVar258;
    auVar40._12_4_ = local_280._12_4_ * fVar259;
    auVar40._16_4_ = local_280._16_4_ * 0.0;
    auVar40._20_4_ = local_280._20_4_ * 0.0;
    auVar40._24_4_ = local_280._24_4_ * 0.0;
    auVar40._28_4_ = auVar111._28_4_;
    auVar109 = vmulps_avx512vl(local_2a0,auVar39);
    auVar41._4_4_ = fVar257 * local_2c0._4_4_;
    auVar41._0_4_ = fVar252 * local_2c0._0_4_;
    auVar41._8_4_ = fVar258 * local_2c0._8_4_;
    auVar41._12_4_ = fVar259 * local_2c0._12_4_;
    auVar41._16_4_ = local_2c0._16_4_ * 0.0;
    auVar41._20_4_ = local_2c0._20_4_ * 0.0;
    auVar41._24_4_ = local_2c0._24_4_ * 0.0;
    auVar41._28_4_ = auVar256._28_4_;
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar38,auVar272._0_32_);
    auVar110 = vfmadd231ps_avx512vl(auVar40,auVar38,auVar106);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar38,auVar273._0_32_);
    auVar86 = vfmadd231ps_fma(auVar41,auVar107,auVar38);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar37,auVar104);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar37,auVar105);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar37,auVar271._0_32_);
    auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar101,auVar37);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar36,auVar102);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar36,auVar100);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar36,auVar103);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar270._0_32_,auVar36);
    auVar42._4_4_ = auVar108._4_4_ * fVar242;
    auVar42._0_4_ = auVar108._0_4_ * fVar242;
    auVar42._8_4_ = auVar108._8_4_ * fVar242;
    auVar42._12_4_ = auVar108._12_4_ * fVar242;
    auVar42._16_4_ = auVar108._16_4_ * fVar242;
    auVar42._20_4_ = auVar108._20_4_ * fVar242;
    auVar42._24_4_ = auVar108._24_4_ * fVar242;
    auVar42._28_4_ = auVar107._28_4_;
    auVar268 = ZEXT3264(auVar42);
    auVar43._4_4_ = auVar110._4_4_ * fVar242;
    auVar43._0_4_ = auVar110._0_4_ * fVar242;
    auVar43._8_4_ = auVar110._8_4_ * fVar242;
    auVar43._12_4_ = auVar110._12_4_ * fVar242;
    auVar43._16_4_ = auVar110._16_4_ * fVar242;
    auVar43._20_4_ = auVar110._20_4_ * fVar242;
    auVar43._24_4_ = auVar110._24_4_ * fVar242;
    auVar43._28_4_ = 0x3e2aaaab;
    auVar44._4_4_ = auVar109._4_4_ * fVar242;
    auVar44._0_4_ = auVar109._0_4_ * fVar242;
    auVar44._8_4_ = auVar109._8_4_ * fVar242;
    auVar44._12_4_ = auVar109._12_4_ * fVar242;
    auVar44._16_4_ = auVar109._16_4_ * fVar242;
    auVar44._20_4_ = auVar109._20_4_ * fVar242;
    auVar44._24_4_ = auVar109._24_4_ * fVar242;
    auVar44._28_4_ = 0x40c00000;
    fVar252 = auVar111._0_4_ * fVar242;
    fVar257 = auVar111._4_4_ * fVar242;
    auVar45._4_4_ = fVar257;
    auVar45._0_4_ = fVar252;
    fVar258 = auVar111._8_4_ * fVar242;
    auVar45._8_4_ = fVar258;
    fVar259 = auVar111._12_4_ * fVar242;
    auVar45._12_4_ = fVar259;
    fVar230 = auVar111._16_4_ * fVar242;
    auVar45._16_4_ = fVar230;
    fVar231 = auVar111._20_4_ * fVar242;
    auVar45._20_4_ = fVar231;
    fVar232 = auVar111._24_4_ * fVar242;
    auVar45._24_4_ = fVar232;
    auVar45._28_4_ = fVar242;
    auVar86 = vxorps_avx512vl(auVar274._0_16_,auVar274._0_16_);
    auVar114 = vpermt2ps_avx512vl(auVar98,_DAT_01feed00,ZEXT1632(auVar86));
    auVar261 = ZEXT3264(auVar114);
    auVar115 = vpermt2ps_avx512vl(auVar112,_DAT_01feed00,ZEXT1632(auVar86));
    auVar263 = ZEXT3264(auVar115);
    auVar110 = ZEXT1632(auVar86);
    auVar116 = vpermt2ps_avx512vl(auVar113,_DAT_01feed00,auVar110);
    auVar265 = ZEXT3264(auVar116);
    auVar237._0_4_ = fVar252 + auVar99._0_4_;
    auVar237._4_4_ = fVar257 + auVar99._4_4_;
    auVar237._8_4_ = fVar258 + auVar99._8_4_;
    auVar237._12_4_ = fVar259 + auVar99._12_4_;
    auVar237._16_4_ = fVar230 + auVar99._16_4_;
    auVar237._20_4_ = fVar231 + auVar99._20_4_;
    auVar237._24_4_ = fVar232 + auVar99._24_4_;
    auVar237._28_4_ = fVar242 + auVar99._28_4_;
    auVar108 = vmaxps_avx(auVar99,auVar237);
    auVar109 = vminps_avx(auVar99,auVar237);
    auVar117 = vpermt2ps_avx512vl(auVar99,_DAT_01feed00,auVar110);
    auVar118 = vpermt2ps_avx512vl(auVar42,_DAT_01feed00,auVar110);
    auVar256 = ZEXT3264(auVar118);
    auVar119 = vpermt2ps_avx512vl(auVar43,_DAT_01feed00,auVar110);
    auVar134 = ZEXT1632(auVar86);
    auVar120 = vpermt2ps_avx512vl(auVar44,_DAT_01feed00,auVar134);
    auVar99 = vpermt2ps_avx512vl(auVar45,_DAT_01feed00,auVar134);
    auVar121 = vsubps_avx512vl(auVar117,auVar99);
    auVar99 = vsubps_avx(auVar114,auVar98);
    auVar251 = ZEXT3264(auVar99);
    auVar110 = vsubps_avx(auVar115,auVar112);
    auVar111 = vsubps_avx(auVar116,auVar113);
    auVar245 = ZEXT3264(auVar111);
    auVar122 = vmulps_avx512vl(auVar110,auVar44);
    auVar122 = vfmsub231ps_avx512vl(auVar122,auVar43,auVar111);
    auVar123 = vmulps_avx512vl(auVar111,auVar42);
    auVar123 = vfmsub231ps_avx512vl(auVar123,auVar44,auVar99);
    auVar124 = vmulps_avx512vl(auVar99,auVar43);
    auVar124 = vfmsub231ps_avx512vl(auVar124,auVar42,auVar110);
    auVar124 = vmulps_avx512vl(auVar124,auVar124);
    auVar123 = vfmadd231ps_avx512vl(auVar124,auVar123,auVar123);
    auVar122 = vfmadd231ps_avx512vl(auVar123,auVar122,auVar122);
    auVar123 = vmulps_avx512vl(auVar111,auVar111);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar110,auVar110);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar99,auVar99);
    auVar124 = vrcp14ps_avx512vl(auVar123);
    auVar125 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar126 = vfnmadd213ps_avx512vl(auVar124,auVar123,auVar125);
    auVar124 = vfmadd132ps_avx512vl(auVar126,auVar124,auVar124);
    auVar122 = vmulps_avx512vl(auVar122,auVar124);
    auVar126 = vmulps_avx512vl(auVar110,auVar120);
    auVar126 = vfmsub231ps_avx512vl(auVar126,auVar119,auVar111);
    auVar127 = vmulps_avx512vl(auVar111,auVar118);
    auVar127 = vfmsub231ps_avx512vl(auVar127,auVar120,auVar99);
    auVar128 = vmulps_avx512vl(auVar99,auVar119);
    auVar128 = vfmsub231ps_avx512vl(auVar128,auVar118,auVar110);
    auVar128 = vmulps_avx512vl(auVar128,auVar128);
    auVar127 = vfmadd231ps_avx512vl(auVar128,auVar127,auVar127);
    auVar126 = vfmadd231ps_avx512vl(auVar127,auVar126,auVar126);
    auVar124 = vmulps_avx512vl(auVar126,auVar124);
    auVar122 = vmaxps_avx512vl(auVar122,auVar124);
    auVar122 = vsqrtps_avx512vl(auVar122);
    auVar124 = vmaxps_avx512vl(auVar121,auVar117);
    auVar108 = vmaxps_avx512vl(auVar108,auVar124);
    auVar124 = vaddps_avx512vl(auVar122,auVar108);
    auVar108 = vminps_avx512vl(auVar121,auVar117);
    auVar108 = vminps_avx(auVar109,auVar108);
    auVar108 = vsubps_avx512vl(auVar108,auVar122);
    auVar126._8_4_ = 0x3f800002;
    auVar126._0_8_ = 0x3f8000023f800002;
    auVar126._12_4_ = 0x3f800002;
    auVar126._16_4_ = 0x3f800002;
    auVar126._20_4_ = 0x3f800002;
    auVar126._24_4_ = 0x3f800002;
    auVar126._28_4_ = 0x3f800002;
    auVar109 = vmulps_avx512vl(auVar124,auVar126);
    auVar127._8_4_ = 0x3f7ffffc;
    auVar127._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar127._12_4_ = 0x3f7ffffc;
    auVar127._16_4_ = 0x3f7ffffc;
    auVar127._20_4_ = 0x3f7ffffc;
    auVar127._24_4_ = 0x3f7ffffc;
    auVar127._28_4_ = 0x3f7ffffc;
    auVar108 = vmulps_avx512vl(auVar108,auVar127);
    auVar109 = vmulps_avx512vl(auVar109,auVar109);
    auVar117 = vrsqrt14ps_avx512vl(auVar123);
    auVar128._8_4_ = 0xbf000000;
    auVar128._0_8_ = 0xbf000000bf000000;
    auVar128._12_4_ = 0xbf000000;
    auVar128._16_4_ = 0xbf000000;
    auVar128._20_4_ = 0xbf000000;
    auVar128._24_4_ = 0xbf000000;
    auVar128._28_4_ = 0xbf000000;
    auVar121 = vmulps_avx512vl(auVar123,auVar128);
    fVar252 = auVar117._0_4_;
    fVar257 = auVar117._4_4_;
    fVar258 = auVar117._8_4_;
    fVar259 = auVar117._12_4_;
    fVar230 = auVar117._16_4_;
    fVar231 = auVar117._20_4_;
    fVar232 = auVar117._24_4_;
    auVar46._4_4_ = fVar257 * fVar257 * fVar257 * auVar121._4_4_;
    auVar46._0_4_ = fVar252 * fVar252 * fVar252 * auVar121._0_4_;
    auVar46._8_4_ = fVar258 * fVar258 * fVar258 * auVar121._8_4_;
    auVar46._12_4_ = fVar259 * fVar259 * fVar259 * auVar121._12_4_;
    auVar46._16_4_ = fVar230 * fVar230 * fVar230 * auVar121._16_4_;
    auVar46._20_4_ = fVar231 * fVar231 * fVar231 * auVar121._20_4_;
    auVar46._24_4_ = fVar232 * fVar232 * fVar232 * auVar121._24_4_;
    auVar46._28_4_ = auVar124._28_4_;
    auVar129._8_4_ = 0x3fc00000;
    auVar129._0_8_ = 0x3fc000003fc00000;
    auVar129._12_4_ = 0x3fc00000;
    auVar129._16_4_ = 0x3fc00000;
    auVar129._20_4_ = 0x3fc00000;
    auVar129._24_4_ = 0x3fc00000;
    auVar129._28_4_ = 0x3fc00000;
    auVar117 = vfmadd231ps_avx512vl(auVar46,auVar117,auVar129);
    auVar121 = vmulps_avx512vl(auVar99,auVar117);
    auVar122 = vmulps_avx512vl(auVar110,auVar117);
    auVar123 = vmulps_avx512vl(auVar111,auVar117);
    auVar124 = vsubps_avx512vl(auVar134,auVar98);
    auVar126 = vsubps_avx512vl(auVar134,auVar112);
    auVar127 = vsubps_avx512vl(auVar134,auVar113);
    auVar128 = vmulps_avx512vl(local_5e0,auVar127);
    auVar128 = vfmadd231ps_avx512vl(auVar128,local_5c0,auVar126);
    auVar128 = vfmadd231ps_avx512vl(auVar128,local_5a0,auVar124);
    auVar129 = vmulps_avx512vl(auVar127,auVar127);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar126,auVar126);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar124,auVar124);
    auVar130 = vmulps_avx512vl(local_5e0,auVar123);
    auVar130 = vfmadd231ps_avx512vl(auVar130,auVar122,local_5c0);
    auVar131 = vfmadd231ps_avx512vl(auVar130,auVar121,local_5a0);
    auVar123 = vmulps_avx512vl(auVar127,auVar123);
    auVar122 = vfmadd231ps_avx512vl(auVar123,auVar126,auVar122);
    auVar121 = vfmadd231ps_avx512vl(auVar122,auVar124,auVar121);
    auVar122 = vmulps_avx512vl(auVar131,auVar131);
    auVar123 = vsubps_avx512vl(local_220,auVar122);
    auVar130 = vmulps_avx512vl(auVar131,auVar121);
    auVar128 = vsubps_avx512vl(auVar128,auVar130);
    auVar128 = vaddps_avx512vl(auVar128,auVar128);
    auVar130 = vmulps_avx512vl(auVar121,auVar121);
    local_820 = vsubps_avx512vl(auVar129,auVar130);
    auVar109 = vsubps_avx512vl(local_820,auVar109);
    local_740 = vmulps_avx512vl(auVar128,auVar128);
    auVar130._8_4_ = 0x40800000;
    auVar130._0_8_ = 0x4080000040800000;
    auVar130._12_4_ = 0x40800000;
    auVar130._16_4_ = 0x40800000;
    auVar130._20_4_ = 0x40800000;
    auVar130._24_4_ = 0x40800000;
    auVar130._28_4_ = 0x40800000;
    _local_8a0 = vmulps_avx512vl(auVar123,auVar130);
    auVar129 = vmulps_avx512vl(_local_8a0,auVar109);
    auVar129 = vsubps_avx512vl(local_740,auVar129);
    uVar78 = vcmpps_avx512vl(auVar129,auVar134,5);
    bVar70 = (byte)uVar78;
    fVar252 = (float)local_7e0._0_4_;
    fVar257 = (float)local_7e0._4_4_;
    fVar258 = fStack_7d8;
    fVar259 = fStack_7d4;
    fVar230 = fStack_7d0;
    fVar231 = fStack_7cc;
    fVar232 = fStack_7c8;
    fVar214 = fStack_7c4;
    if (bVar70 == 0) {
      auVar274 = ZEXT3264(auVar125);
LAB_01d712ec:
      auVar270 = ZEXT3264(local_8e0);
      auVar271 = ZEXT3264(local_900);
      auVar272 = ZEXT3264(local_920);
      auVar273 = ZEXT3264(local_940);
    }
    else {
      auVar129 = vsqrtps_avx512vl(auVar129);
      auVar130 = vaddps_avx512vl(auVar123,auVar123);
      local_600 = vrcp14ps_avx512vl(auVar130);
      auVar125 = vfnmadd213ps_avx512vl(local_600,auVar130,auVar125);
      auVar125 = vfmadd132ps_avx512vl(auVar125,local_600,local_600);
      local_8c0 = vxorps_avx512vl(auVar128,auVar97);
      auVar97 = vsubps_avx512vl(local_8c0,auVar129);
      auVar97 = vmulps_avx512vl(auVar97,auVar125);
      auVar129 = vsubps_avx512vl(auVar129,auVar128);
      _local_620 = vmulps_avx512vl(auVar129,auVar125);
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar129 = vblendmps_avx512vl(auVar125,auVar97);
      auVar132._0_4_ =
           (uint)(bVar70 & 1) * auVar129._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar125._0_4_;
      bVar7 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar132._4_4_ = (uint)bVar7 * auVar129._4_4_ | (uint)!bVar7 * auVar125._4_4_;
      bVar7 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar132._8_4_ = (uint)bVar7 * auVar129._8_4_ | (uint)!bVar7 * auVar125._8_4_;
      bVar7 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar132._12_4_ = (uint)bVar7 * auVar129._12_4_ | (uint)!bVar7 * auVar125._12_4_;
      bVar7 = (bool)((byte)(uVar78 >> 4) & 1);
      auVar132._16_4_ = (uint)bVar7 * auVar129._16_4_ | (uint)!bVar7 * auVar125._16_4_;
      bVar7 = (bool)((byte)(uVar78 >> 5) & 1);
      auVar132._20_4_ = (uint)bVar7 * auVar129._20_4_ | (uint)!bVar7 * auVar125._20_4_;
      bVar7 = (bool)((byte)(uVar78 >> 6) & 1);
      auVar132._24_4_ = (uint)bVar7 * auVar129._24_4_ | (uint)!bVar7 * auVar125._24_4_;
      bVar7 = SUB81(uVar78 >> 7,0);
      auVar132._28_4_ = (uint)bVar7 * auVar129._28_4_ | (uint)!bVar7 * auVar125._28_4_;
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar129 = vblendmps_avx512vl(auVar125,_local_620);
      auVar133._0_4_ =
           (uint)(bVar70 & 1) * auVar129._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar125._0_4_;
      bVar7 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar133._4_4_ = (uint)bVar7 * auVar129._4_4_ | (uint)!bVar7 * auVar125._4_4_;
      bVar7 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar133._8_4_ = (uint)bVar7 * auVar129._8_4_ | (uint)!bVar7 * auVar125._8_4_;
      bVar7 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar133._12_4_ = (uint)bVar7 * auVar129._12_4_ | (uint)!bVar7 * auVar125._12_4_;
      bVar7 = (bool)((byte)(uVar78 >> 4) & 1);
      auVar133._16_4_ = (uint)bVar7 * auVar129._16_4_ | (uint)!bVar7 * auVar125._16_4_;
      bVar7 = (bool)((byte)(uVar78 >> 5) & 1);
      auVar133._20_4_ = (uint)bVar7 * auVar129._20_4_ | (uint)!bVar7 * auVar125._20_4_;
      bVar7 = (bool)((byte)(uVar78 >> 6) & 1);
      auVar133._24_4_ = (uint)bVar7 * auVar129._24_4_ | (uint)!bVar7 * auVar125._24_4_;
      bVar7 = SUB81(uVar78 >> 7,0);
      auVar133._28_4_ = (uint)bVar7 * auVar129._28_4_ | (uint)!bVar7 * auVar125._28_4_;
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar122,auVar125);
      local_640 = vmaxps_avx512vl(local_240,auVar125);
      auVar27._8_4_ = 0x36000000;
      auVar27._0_8_ = 0x3600000036000000;
      auVar27._12_4_ = 0x36000000;
      auVar27._16_4_ = 0x36000000;
      auVar27._20_4_ = 0x36000000;
      auVar27._24_4_ = 0x36000000;
      auVar27._28_4_ = 0x36000000;
      local_660 = vmulps_avx512vl(local_640,auVar27);
      vandps_avx512vl(auVar123,auVar125);
      uVar73 = vcmpps_avx512vl(local_660,local_660,1);
      uVar78 = uVar78 & uVar73;
      bVar74 = (byte)uVar78;
      if (bVar74 != 0) {
        uVar73 = vcmpps_avx512vl(auVar109,_DAT_01faff00,2);
        auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar122 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar123 = vblendmps_avx512vl(auVar109,auVar122);
        bVar75 = (byte)uVar73;
        uVar83 = (uint)(bVar75 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar75 & 1) * local_660._0_4_;
        bVar7 = (bool)((byte)(uVar73 >> 1) & 1);
        uVar82 = (uint)bVar7 * auVar123._4_4_ | (uint)!bVar7 * local_660._4_4_;
        bVar7 = (bool)((byte)(uVar73 >> 2) & 1);
        uVar147 = (uint)bVar7 * auVar123._8_4_ | (uint)!bVar7 * local_660._8_4_;
        bVar7 = (bool)((byte)(uVar73 >> 3) & 1);
        uVar148 = (uint)bVar7 * auVar123._12_4_ | (uint)!bVar7 * local_660._12_4_;
        bVar7 = (bool)((byte)(uVar73 >> 4) & 1);
        uVar149 = (uint)bVar7 * auVar123._16_4_ | (uint)!bVar7 * local_660._16_4_;
        bVar7 = (bool)((byte)(uVar73 >> 5) & 1);
        uVar150 = (uint)bVar7 * auVar123._20_4_ | (uint)!bVar7 * local_660._20_4_;
        bVar7 = (bool)((byte)(uVar73 >> 6) & 1);
        uVar151 = (uint)bVar7 * auVar123._24_4_ | (uint)!bVar7 * local_660._24_4_;
        bVar7 = SUB81(uVar73 >> 7,0);
        uVar152 = (uint)bVar7 * auVar123._28_4_ | (uint)!bVar7 * local_660._28_4_;
        auVar132._0_4_ = (bVar74 & 1) * uVar83 | !(bool)(bVar74 & 1) * auVar132._0_4_;
        bVar7 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar132._4_4_ = bVar7 * uVar82 | !bVar7 * auVar132._4_4_;
        bVar7 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar132._8_4_ = bVar7 * uVar147 | !bVar7 * auVar132._8_4_;
        bVar7 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar132._12_4_ = bVar7 * uVar148 | !bVar7 * auVar132._12_4_;
        bVar7 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar132._16_4_ = bVar7 * uVar149 | !bVar7 * auVar132._16_4_;
        bVar7 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar132._20_4_ = bVar7 * uVar150 | !bVar7 * auVar132._20_4_;
        bVar7 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar132._24_4_ = bVar7 * uVar151 | !bVar7 * auVar132._24_4_;
        bVar7 = SUB81(uVar78 >> 7,0);
        auVar132._28_4_ = bVar7 * uVar152 | !bVar7 * auVar132._28_4_;
        auVar109 = vblendmps_avx512vl(auVar122,auVar109);
        bVar7 = (bool)((byte)(uVar73 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar73 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar73 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar73 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar73 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
        bVar14 = SUB81(uVar73 >> 7,0);
        auVar133._0_4_ =
             (uint)(bVar74 & 1) *
             ((uint)(bVar75 & 1) * auVar109._0_4_ | !(bool)(bVar75 & 1) * uVar83) |
             !(bool)(bVar74 & 1) * auVar133._0_4_;
        bVar8 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar133._4_4_ =
             (uint)bVar8 * ((uint)bVar7 * auVar109._4_4_ | !bVar7 * uVar82) |
             !bVar8 * auVar133._4_4_;
        bVar7 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar133._8_4_ =
             (uint)bVar7 * ((uint)bVar9 * auVar109._8_4_ | !bVar9 * uVar147) |
             !bVar7 * auVar133._8_4_;
        bVar7 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar133._12_4_ =
             (uint)bVar7 * ((uint)bVar10 * auVar109._12_4_ | !bVar10 * uVar148) |
             !bVar7 * auVar133._12_4_;
        bVar7 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar133._16_4_ =
             (uint)bVar7 * ((uint)bVar11 * auVar109._16_4_ | !bVar11 * uVar149) |
             !bVar7 * auVar133._16_4_;
        bVar7 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar133._20_4_ =
             (uint)bVar7 * ((uint)bVar12 * auVar109._20_4_ | !bVar12 * uVar150) |
             !bVar7 * auVar133._20_4_;
        bVar7 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar133._24_4_ =
             (uint)bVar7 * ((uint)bVar13 * auVar109._24_4_ | !bVar13 * uVar151) |
             !bVar7 * auVar133._24_4_;
        bVar7 = SUB81(uVar78 >> 7,0);
        auVar133._28_4_ =
             (uint)bVar7 * ((uint)bVar14 * auVar109._28_4_ | !bVar14 * uVar152) |
             !bVar7 * auVar133._28_4_;
        bVar70 = (~bVar74 | bVar75) & bVar70;
      }
      if ((bVar70 & 0x7f) == 0) {
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar274 = ZEXT3264(auVar108);
        goto LAB_01d712ec;
      }
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar120 = vxorps_avx512vl(auVar120,auVar109);
      auVar118 = vxorps_avx512vl(auVar118,auVar109);
      uVar83 = *(uint *)(ray + k * 4 + 0x100);
      auVar119 = vxorps_avx512vl(auVar119,auVar109);
      local_840 = ZEXT416(uVar83);
      auVar86 = vsubss_avx512f(local_840,ZEXT416((uint)local_6f0._0_4_));
      auVar122 = vbroadcastss_avx512vl(auVar86);
      auVar122 = vminps_avx512vl(auVar122,auVar133);
      auVar68._4_4_ = fStack_2dc;
      auVar68._0_4_ = local_2e0;
      auVar68._8_4_ = fStack_2d8;
      auVar68._12_4_ = fStack_2d4;
      auVar68._16_4_ = fStack_2d0;
      auVar68._20_4_ = fStack_2cc;
      auVar68._24_4_ = fStack_2c8;
      auVar68._28_4_ = fStack_2c4;
      auVar123 = vmaxps_avx512vl(auVar68,auVar132);
      auVar125 = vmulps_avx512vl(auVar44,auVar127);
      auVar125 = vfmadd213ps_avx512vl(auVar126,auVar43,auVar125);
      auVar86 = vfmadd213ps_fma(auVar124,auVar42,auVar125);
      auVar124 = vmulps_avx512vl(local_5e0,auVar44);
      auVar124 = vfmadd231ps_avx512vl(auVar124,local_5c0,auVar43);
      auVar91 = vfmadd231ps_fma(auVar124,local_5a0,auVar42);
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(ZEXT1632(auVar91),auVar124);
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar17 = vcmpps_avx512vl(auVar124,auVar125,1);
      auVar126 = vxorps_avx512vl(ZEXT1632(auVar86),auVar109);
      auVar127 = vrcp14ps_avx512vl(ZEXT1632(auVar91));
      auVar227 = ZEXT1632(auVar91);
      auVar129 = vxorps_avx512vl(auVar227,auVar109);
      auVar134 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar135 = vfnmadd213ps_avx512vl(auVar127,auVar227,auVar134);
      auVar86 = vfmadd132ps_fma(auVar135,auVar127,auVar127);
      fVar233 = auVar86._0_4_ * auVar126._0_4_;
      fVar240 = auVar86._4_4_ * auVar126._4_4_;
      auVar47._4_4_ = fVar240;
      auVar47._0_4_ = fVar233;
      fVar241 = auVar86._8_4_ * auVar126._8_4_;
      auVar47._8_4_ = fVar241;
      fVar242 = auVar86._12_4_ * auVar126._12_4_;
      auVar47._12_4_ = fVar242;
      fVar155 = auVar126._16_4_ * 0.0;
      auVar47._16_4_ = fVar155;
      fVar171 = auVar126._20_4_ * 0.0;
      auVar47._20_4_ = fVar171;
      fVar172 = auVar126._24_4_ * 0.0;
      auVar47._24_4_ = fVar172;
      auVar47._28_4_ = auVar126._28_4_;
      uVar18 = vcmpps_avx512vl(auVar227,auVar129,1);
      bVar74 = (byte)uVar17 | (byte)uVar18;
      auVar269._8_4_ = 0xff800000;
      auVar269._0_8_ = 0xff800000ff800000;
      auVar269._12_4_ = 0xff800000;
      auVar269._16_4_ = 0xff800000;
      auVar269._20_4_ = 0xff800000;
      auVar269._24_4_ = 0xff800000;
      auVar269._28_4_ = 0xff800000;
      auVar135 = vblendmps_avx512vl(auVar47,auVar269);
      auVar136._0_4_ =
           (uint)(bVar74 & 1) * auVar135._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar127._0_4_;
      bVar7 = (bool)(bVar74 >> 1 & 1);
      auVar136._4_4_ = (uint)bVar7 * auVar135._4_4_ | (uint)!bVar7 * auVar127._4_4_;
      bVar7 = (bool)(bVar74 >> 2 & 1);
      auVar136._8_4_ = (uint)bVar7 * auVar135._8_4_ | (uint)!bVar7 * auVar127._8_4_;
      bVar7 = (bool)(bVar74 >> 3 & 1);
      auVar136._12_4_ = (uint)bVar7 * auVar135._12_4_ | (uint)!bVar7 * auVar127._12_4_;
      bVar7 = (bool)(bVar74 >> 4 & 1);
      auVar136._16_4_ = (uint)bVar7 * auVar135._16_4_ | (uint)!bVar7 * auVar127._16_4_;
      bVar7 = (bool)(bVar74 >> 5 & 1);
      auVar136._20_4_ = (uint)bVar7 * auVar135._20_4_ | (uint)!bVar7 * auVar127._20_4_;
      bVar7 = (bool)(bVar74 >> 6 & 1);
      auVar136._24_4_ = (uint)bVar7 * auVar135._24_4_ | (uint)!bVar7 * auVar127._24_4_;
      auVar136._28_4_ =
           (uint)(bVar74 >> 7) * auVar135._28_4_ | (uint)!(bool)(bVar74 >> 7) * auVar127._28_4_;
      auVar123 = vmaxps_avx512vl(auVar123,auVar136);
      auVar268 = ZEXT3264(auVar123);
      uVar18 = vcmpps_avx512vl(auVar227,auVar129,6);
      bVar74 = (byte)uVar17 | (byte)uVar18;
      auVar127 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar137._0_4_ =
           (uint)(bVar74 & 1) * auVar127._0_4_ | (uint)!(bool)(bVar74 & 1) * (int)fVar233;
      bVar7 = (bool)(bVar74 >> 1 & 1);
      auVar137._4_4_ = (uint)bVar7 * auVar127._4_4_ | (uint)!bVar7 * (int)fVar240;
      bVar7 = (bool)(bVar74 >> 2 & 1);
      auVar137._8_4_ = (uint)bVar7 * auVar127._8_4_ | (uint)!bVar7 * (int)fVar241;
      bVar7 = (bool)(bVar74 >> 3 & 1);
      auVar137._12_4_ = (uint)bVar7 * auVar127._12_4_ | (uint)!bVar7 * (int)fVar242;
      bVar7 = (bool)(bVar74 >> 4 & 1);
      auVar137._16_4_ = (uint)bVar7 * auVar127._16_4_ | (uint)!bVar7 * (int)fVar155;
      bVar7 = (bool)(bVar74 >> 5 & 1);
      auVar137._20_4_ = (uint)bVar7 * auVar127._20_4_ | (uint)!bVar7 * (int)fVar171;
      bVar7 = (bool)(bVar74 >> 6 & 1);
      auVar137._24_4_ = (uint)bVar7 * auVar127._24_4_ | (uint)!bVar7 * (int)fVar172;
      auVar137._28_4_ =
           (uint)(bVar74 >> 7) * auVar127._28_4_ | (uint)!(bool)(bVar74 >> 7) * auVar126._28_4_;
      auVar126 = vminps_avx512vl(auVar122,auVar137);
      auVar86 = vxorps_avx512vl(auVar122._0_16_,auVar122._0_16_);
      auVar114 = vsubps_avx512vl(ZEXT1632(auVar86),auVar114);
      auVar115 = vsubps_avx512vl(ZEXT1632(auVar86),auVar115);
      auVar122 = ZEXT1632(auVar86);
      auVar116 = vsubps_avx512vl(auVar122,auVar116);
      auVar116 = vmulps_avx512vl(auVar116,auVar120);
      auVar115 = vfmadd231ps_avx512vl(auVar116,auVar119,auVar115);
      auVar114 = vfmadd231ps_avx512vl(auVar115,auVar118,auVar114);
      auVar115 = vmulps_avx512vl(local_5e0,auVar120);
      auVar115 = vfmadd231ps_avx512vl(auVar115,local_5c0,auVar119);
      auVar115 = vfmadd231ps_avx512vl(auVar115,local_5a0,auVar118);
      vandps_avx512vl(auVar115,auVar124);
      uVar17 = vcmpps_avx512vl(auVar115,auVar125,1);
      auVar114 = vxorps_avx512vl(auVar114,auVar109);
      auVar116 = vrcp14ps_avx512vl(auVar115);
      auVar109 = vxorps_avx512vl(auVar115,auVar109);
      auVar265 = ZEXT3264(auVar109);
      auVar118 = vfnmadd213ps_avx512vl(auVar116,auVar115,auVar134);
      auVar86 = vfmadd132ps_fma(auVar118,auVar116,auVar116);
      fVar233 = auVar86._0_4_ * auVar114._0_4_;
      fVar240 = auVar86._4_4_ * auVar114._4_4_;
      auVar48._4_4_ = fVar240;
      auVar48._0_4_ = fVar233;
      fVar241 = auVar86._8_4_ * auVar114._8_4_;
      auVar48._8_4_ = fVar241;
      fVar242 = auVar86._12_4_ * auVar114._12_4_;
      auVar48._12_4_ = fVar242;
      fVar155 = auVar114._16_4_ * 0.0;
      auVar48._16_4_ = fVar155;
      fVar171 = auVar114._20_4_ * 0.0;
      auVar48._20_4_ = fVar171;
      fVar172 = auVar114._24_4_ * 0.0;
      auVar48._24_4_ = fVar172;
      auVar48._28_4_ = auVar114._28_4_;
      uVar18 = vcmpps_avx512vl(auVar115,auVar109,1);
      bVar74 = (byte)uVar17 | (byte)uVar18;
      auVar118 = vblendmps_avx512vl(auVar48,auVar269);
      auVar138._0_4_ =
           (uint)(bVar74 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar116._0_4_;
      bVar7 = (bool)(bVar74 >> 1 & 1);
      auVar138._4_4_ = (uint)bVar7 * auVar118._4_4_ | (uint)!bVar7 * auVar116._4_4_;
      bVar7 = (bool)(bVar74 >> 2 & 1);
      auVar138._8_4_ = (uint)bVar7 * auVar118._8_4_ | (uint)!bVar7 * auVar116._8_4_;
      bVar7 = (bool)(bVar74 >> 3 & 1);
      auVar138._12_4_ = (uint)bVar7 * auVar118._12_4_ | (uint)!bVar7 * auVar116._12_4_;
      bVar7 = (bool)(bVar74 >> 4 & 1);
      auVar138._16_4_ = (uint)bVar7 * auVar118._16_4_ | (uint)!bVar7 * auVar116._16_4_;
      bVar7 = (bool)(bVar74 >> 5 & 1);
      auVar138._20_4_ = (uint)bVar7 * auVar118._20_4_ | (uint)!bVar7 * auVar116._20_4_;
      bVar7 = (bool)(bVar74 >> 6 & 1);
      auVar138._24_4_ = (uint)bVar7 * auVar118._24_4_ | (uint)!bVar7 * auVar116._24_4_;
      auVar138._28_4_ =
           (uint)(bVar74 >> 7) * auVar118._28_4_ | (uint)!(bool)(bVar74 >> 7) * auVar116._28_4_;
      auVar263 = ZEXT3264(auVar138);
      _local_680 = vmaxps_avx(auVar123,auVar138);
      auVar256 = ZEXT3264(_local_680);
      uVar18 = vcmpps_avx512vl(auVar115,auVar109,6);
      bVar74 = (byte)uVar17 | (byte)uVar18;
      auVar139._0_4_ =
           (uint)(bVar74 & 1) * auVar127._0_4_ | (uint)!(bool)(bVar74 & 1) * (int)fVar233;
      bVar7 = (bool)(bVar74 >> 1 & 1);
      auVar139._4_4_ = (uint)bVar7 * auVar127._4_4_ | (uint)!bVar7 * (int)fVar240;
      bVar7 = (bool)(bVar74 >> 2 & 1);
      auVar139._8_4_ = (uint)bVar7 * auVar127._8_4_ | (uint)!bVar7 * (int)fVar241;
      bVar7 = (bool)(bVar74 >> 3 & 1);
      auVar139._12_4_ = (uint)bVar7 * auVar127._12_4_ | (uint)!bVar7 * (int)fVar242;
      bVar7 = (bool)(bVar74 >> 4 & 1);
      auVar139._16_4_ = (uint)bVar7 * auVar127._16_4_ | (uint)!bVar7 * (int)fVar155;
      bVar7 = (bool)(bVar74 >> 5 & 1);
      auVar139._20_4_ = (uint)bVar7 * auVar127._20_4_ | (uint)!bVar7 * (int)fVar171;
      bVar7 = (bool)(bVar74 >> 6 & 1);
      auVar139._24_4_ = (uint)bVar7 * auVar127._24_4_ | (uint)!bVar7 * (int)fVar172;
      auVar139._28_4_ =
           (uint)(bVar74 >> 7) * auVar127._28_4_ | (uint)!(bool)(bVar74 >> 7) * auVar114._28_4_;
      local_360 = vminps_avx(auVar126,auVar139);
      auVar261 = ZEXT3264(local_360);
      uVar17 = vcmpps_avx512vl(_local_680,local_360,2);
      bVar70 = bVar70 & 0x7f & (byte)uVar17;
      if (bVar70 == 0) {
        auVar274 = ZEXT3264(auVar134);
        goto LAB_01d712ec;
      }
      auVar109 = vmaxps_avx512vl(auVar122,auVar108);
      auVar108 = vfmadd213ps_avx512vl(auVar97,auVar131,auVar121);
      auVar108 = vmulps_avx512vl(auVar117,auVar108);
      auVar97 = vfmadd213ps_avx512vl(_local_620,auVar131,auVar121);
      auVar49._4_4_ = auVar117._4_4_ * auVar97._4_4_;
      auVar49._0_4_ = auVar117._0_4_ * auVar97._0_4_;
      auVar49._8_4_ = auVar117._8_4_ * auVar97._8_4_;
      auVar49._12_4_ = auVar117._12_4_ * auVar97._12_4_;
      auVar49._16_4_ = auVar117._16_4_ * auVar97._16_4_;
      auVar49._20_4_ = auVar117._20_4_ * auVar97._20_4_;
      auVar49._24_4_ = auVar117._24_4_ * auVar97._24_4_;
      auVar49._28_4_ = auVar138._28_4_;
      auVar108 = vminps_avx512vl(auVar108,auVar134);
      auVar56 = ZEXT812(0);
      auVar97 = ZEXT1232(auVar56) << 0x20;
      auVar108 = vmaxps_avx(auVar108,ZEXT1232(auVar56) << 0x20);
      auVar114 = vminps_avx512vl(auVar49,auVar134);
      auVar50._4_4_ = (auVar108._4_4_ + 1.0) * 0.125;
      auVar50._0_4_ = (auVar108._0_4_ + 0.0) * 0.125;
      auVar50._8_4_ = (auVar108._8_4_ + 2.0) * 0.125;
      auVar50._12_4_ = (auVar108._12_4_ + 3.0) * 0.125;
      auVar50._16_4_ = (auVar108._16_4_ + 4.0) * 0.125;
      auVar50._20_4_ = (auVar108._20_4_ + 5.0) * 0.125;
      auVar50._24_4_ = (auVar108._24_4_ + 6.0) * 0.125;
      auVar50._28_4_ = auVar108._28_4_ + 7.0;
      auVar86 = vfmadd213ps_fma(auVar50,auVar162,local_880);
      local_1a0 = ZEXT1632(auVar86);
      auVar108 = vmaxps_avx(auVar114,ZEXT1232(auVar56) << 0x20);
      auVar51._4_4_ = (auVar108._4_4_ + 1.0) * 0.125;
      auVar51._0_4_ = (auVar108._0_4_ + 0.0) * 0.125;
      auVar51._8_4_ = (auVar108._8_4_ + 2.0) * 0.125;
      auVar51._12_4_ = (auVar108._12_4_ + 3.0) * 0.125;
      auVar51._16_4_ = (auVar108._16_4_ + 4.0) * 0.125;
      auVar51._20_4_ = (auVar108._20_4_ + 5.0) * 0.125;
      auVar51._24_4_ = (auVar108._24_4_ + 6.0) * 0.125;
      auVar51._28_4_ = auVar108._28_4_ + 7.0;
      auVar86 = vfmadd213ps_fma(auVar51,auVar162,local_880);
      local_1c0 = ZEXT1632(auVar86);
      auVar52._4_4_ = auVar109._4_4_ * auVar109._4_4_;
      auVar52._0_4_ = auVar109._0_4_ * auVar109._0_4_;
      auVar52._8_4_ = auVar109._8_4_ * auVar109._8_4_;
      auVar52._12_4_ = auVar109._12_4_ * auVar109._12_4_;
      auVar52._16_4_ = auVar109._16_4_ * auVar109._16_4_;
      auVar52._20_4_ = auVar109._20_4_ * auVar109._20_4_;
      auVar52._24_4_ = auVar109._24_4_ * auVar109._24_4_;
      auVar52._28_4_ = auVar109._28_4_;
      auVar108 = vsubps_avx(local_820,auVar52);
      auVar53._4_4_ = auVar108._4_4_ * (float)local_8a0._4_4_;
      auVar53._0_4_ = auVar108._0_4_ * (float)local_8a0._0_4_;
      auVar53._8_4_ = auVar108._8_4_ * fStack_898;
      auVar53._12_4_ = auVar108._12_4_ * fStack_894;
      auVar53._16_4_ = auVar108._16_4_ * fStack_890;
      auVar53._20_4_ = auVar108._20_4_ * fStack_88c;
      auVar53._24_4_ = auVar108._24_4_ * fStack_888;
      auVar53._28_4_ = auVar109._28_4_;
      auVar109 = vsubps_avx(local_740,auVar53);
      uVar17 = vcmpps_avx512vl(auVar109,ZEXT1232(auVar56) << 0x20,5);
      bVar74 = (byte)uVar17;
      auVar272 = ZEXT3264(local_920);
      auVar273 = ZEXT3264(local_940);
      if (bVar74 == 0) {
        bVar74 = 0;
        auVar99 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar245 = ZEXT864(0) << 0x20;
        auVar109 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar114 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar263 = ZEXT864(0) << 0x20;
        auVar140._8_4_ = 0x7f800000;
        auVar140._0_8_ = 0x7f8000007f800000;
        auVar140._12_4_ = 0x7f800000;
        auVar140._16_4_ = 0x7f800000;
        auVar140._20_4_ = 0x7f800000;
        auVar140._24_4_ = 0x7f800000;
        auVar140._28_4_ = 0x7f800000;
        auVar141._8_4_ = 0xff800000;
        auVar141._0_8_ = 0xff800000ff800000;
        auVar141._12_4_ = 0xff800000;
        auVar141._16_4_ = 0xff800000;
        auVar141._20_4_ = 0xff800000;
        auVar141._24_4_ = 0xff800000;
        auVar141._28_4_ = 0xff800000;
      }
      else {
        uVar78 = vcmpps_avx512vl(auVar109,auVar122,5);
        auVar109 = vsqrtps_avx(auVar109);
        auVar97 = vfnmadd213ps_avx512vl(auVar130,local_600,auVar134);
        auVar115 = vfmadd132ps_avx512vl(auVar97,local_600,local_600);
        auVar97 = vsubps_avx(local_8c0,auVar109);
        auVar116 = vmulps_avx512vl(auVar97,auVar115);
        auVar109 = vsubps_avx512vl(auVar109,auVar128);
        auVar115 = vmulps_avx512vl(auVar109,auVar115);
        auVar109 = vfmadd213ps_avx512vl(auVar131,auVar116,auVar121);
        auVar54._4_4_ = auVar117._4_4_ * auVar109._4_4_;
        auVar54._0_4_ = auVar117._0_4_ * auVar109._0_4_;
        auVar54._8_4_ = auVar117._8_4_ * auVar109._8_4_;
        auVar54._12_4_ = auVar117._12_4_ * auVar109._12_4_;
        auVar54._16_4_ = auVar117._16_4_ * auVar109._16_4_;
        auVar54._20_4_ = auVar117._20_4_ * auVar109._20_4_;
        auVar54._24_4_ = auVar117._24_4_ * auVar109._24_4_;
        auVar54._28_4_ = auVar114._28_4_;
        auVar109 = vmulps_avx512vl(local_5a0,auVar116);
        auVar97 = vmulps_avx512vl(local_5c0,auVar116);
        auVar118 = vmulps_avx512vl(local_5e0,auVar116);
        auVar114 = vfmadd213ps_avx512vl(auVar99,auVar54,auVar98);
        auVar109 = vsubps_avx512vl(auVar109,auVar114);
        auVar114 = vfmadd213ps_avx512vl(auVar110,auVar54,auVar112);
        auVar114 = vsubps_avx512vl(auVar97,auVar114);
        auVar86 = vfmadd213ps_fma(auVar54,auVar111,auVar113);
        auVar97 = vsubps_avx(auVar118,ZEXT1632(auVar86));
        auVar263 = ZEXT3264(auVar97);
        auVar97 = vfmadd213ps_avx512vl(auVar131,auVar115,auVar121);
        auVar117 = vmulps_avx512vl(auVar117,auVar97);
        auVar97 = vmulps_avx512vl(local_5a0,auVar115);
        auVar118 = vmulps_avx512vl(local_5c0,auVar115);
        auVar119 = vmulps_avx512vl(local_5e0,auVar115);
        auVar86 = vfmadd213ps_fma(auVar99,auVar117,auVar98);
        auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar86));
        auVar86 = vfmadd213ps_fma(auVar110,auVar117,auVar112);
        auVar99 = vsubps_avx512vl(auVar118,ZEXT1632(auVar86));
        auVar86 = vfmadd213ps_fma(auVar111,auVar117,auVar113);
        auVar110 = vsubps_avx512vl(auVar119,ZEXT1632(auVar86));
        auVar245 = ZEXT3264(auVar110);
        auVar163._8_4_ = 0x7f800000;
        auVar163._0_8_ = 0x7f8000007f800000;
        auVar163._12_4_ = 0x7f800000;
        auVar163._16_4_ = 0x7f800000;
        auVar163._20_4_ = 0x7f800000;
        auVar163._24_4_ = 0x7f800000;
        auVar163._28_4_ = 0x7f800000;
        auVar110 = vblendmps_avx512vl(auVar163,auVar116);
        bVar7 = (bool)((byte)uVar78 & 1);
        auVar140._0_4_ = (uint)bVar7 * auVar110._0_4_ | (uint)!bVar7 * auVar98._0_4_;
        bVar7 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar140._4_4_ = (uint)bVar7 * auVar110._4_4_ | (uint)!bVar7 * auVar98._4_4_;
        bVar7 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar140._8_4_ = (uint)bVar7 * auVar110._8_4_ | (uint)!bVar7 * auVar98._8_4_;
        bVar7 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar140._12_4_ = (uint)bVar7 * auVar110._12_4_ | (uint)!bVar7 * auVar98._12_4_;
        bVar7 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar140._16_4_ = (uint)bVar7 * auVar110._16_4_ | (uint)!bVar7 * auVar98._16_4_;
        bVar7 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar140._20_4_ = (uint)bVar7 * auVar110._20_4_ | (uint)!bVar7 * auVar98._20_4_;
        bVar7 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar140._24_4_ = (uint)bVar7 * auVar110._24_4_ | (uint)!bVar7 * auVar98._24_4_;
        bVar7 = SUB81(uVar78 >> 7,0);
        auVar140._28_4_ = (uint)bVar7 * auVar110._28_4_ | (uint)!bVar7 * auVar98._28_4_;
        auVar164._8_4_ = 0xff800000;
        auVar164._0_8_ = 0xff800000ff800000;
        auVar164._12_4_ = 0xff800000;
        auVar164._16_4_ = 0xff800000;
        auVar164._20_4_ = 0xff800000;
        auVar164._24_4_ = 0xff800000;
        auVar164._28_4_ = 0xff800000;
        auVar110 = vblendmps_avx512vl(auVar164,auVar115);
        bVar7 = (bool)((byte)uVar78 & 1);
        auVar141._0_4_ = (uint)bVar7 * auVar110._0_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar141._4_4_ = (uint)bVar7 * auVar110._4_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar141._8_4_ = (uint)bVar7 * auVar110._8_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar141._12_4_ = (uint)bVar7 * auVar110._12_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar141._16_4_ = (uint)bVar7 * auVar110._16_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar141._20_4_ = (uint)bVar7 * auVar110._20_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar141._24_4_ = (uint)bVar7 * auVar110._24_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = SUB81(uVar78 >> 7,0);
        auVar141._28_4_ = (uint)bVar7 * auVar110._28_4_ | (uint)!bVar7 * -0x800000;
        auVar28._8_4_ = 0x36000000;
        auVar28._0_8_ = 0x3600000036000000;
        auVar28._12_4_ = 0x36000000;
        auVar28._16_4_ = 0x36000000;
        auVar28._20_4_ = 0x36000000;
        auVar28._24_4_ = 0x36000000;
        auVar28._28_4_ = 0x36000000;
        auVar110 = vmulps_avx512vl(local_640,auVar28);
        uVar73 = vcmpps_avx512vl(auVar110,local_660,0xe);
        uVar78 = uVar78 & uVar73;
        bVar75 = (byte)uVar78;
        if (bVar75 != 0) {
          uVar73 = vcmpps_avx512vl(auVar108,ZEXT1632(ZEXT816(0) << 0x40),2);
          auVar250._8_4_ = 0x7f800000;
          auVar250._0_8_ = 0x7f8000007f800000;
          auVar250._12_4_ = 0x7f800000;
          auVar250._16_4_ = 0x7f800000;
          auVar250._20_4_ = 0x7f800000;
          auVar250._24_4_ = 0x7f800000;
          auVar250._28_4_ = 0x7f800000;
          auVar255._8_4_ = 0xff800000;
          auVar255._0_8_ = 0xff800000ff800000;
          auVar255._12_4_ = 0xff800000;
          auVar255._16_4_ = 0xff800000;
          auVar255._20_4_ = 0xff800000;
          auVar255._24_4_ = 0xff800000;
          auVar255._28_4_ = 0xff800000;
          auVar108 = vblendmps_avx512vl(auVar250,auVar255);
          bVar81 = (byte)uVar73;
          uVar82 = (uint)(bVar81 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar81 & 1) * auVar110._0_4_;
          bVar7 = (bool)((byte)(uVar73 >> 1) & 1);
          uVar147 = (uint)bVar7 * auVar108._4_4_ | (uint)!bVar7 * auVar110._4_4_;
          bVar7 = (bool)((byte)(uVar73 >> 2) & 1);
          uVar148 = (uint)bVar7 * auVar108._8_4_ | (uint)!bVar7 * auVar110._8_4_;
          bVar7 = (bool)((byte)(uVar73 >> 3) & 1);
          uVar149 = (uint)bVar7 * auVar108._12_4_ | (uint)!bVar7 * auVar110._12_4_;
          bVar7 = (bool)((byte)(uVar73 >> 4) & 1);
          uVar150 = (uint)bVar7 * auVar108._16_4_ | (uint)!bVar7 * auVar110._16_4_;
          bVar7 = (bool)((byte)(uVar73 >> 5) & 1);
          uVar151 = (uint)bVar7 * auVar108._20_4_ | (uint)!bVar7 * auVar110._20_4_;
          bVar7 = (bool)((byte)(uVar73 >> 6) & 1);
          uVar152 = (uint)bVar7 * auVar108._24_4_ | (uint)!bVar7 * auVar110._24_4_;
          bVar7 = SUB81(uVar73 >> 7,0);
          uVar153 = (uint)bVar7 * auVar108._28_4_ | (uint)!bVar7 * auVar110._28_4_;
          auVar140._0_4_ = (bVar75 & 1) * uVar82 | !(bool)(bVar75 & 1) * auVar140._0_4_;
          bVar7 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar140._4_4_ = bVar7 * uVar147 | !bVar7 * auVar140._4_4_;
          bVar7 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar140._8_4_ = bVar7 * uVar148 | !bVar7 * auVar140._8_4_;
          bVar7 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar140._12_4_ = bVar7 * uVar149 | !bVar7 * auVar140._12_4_;
          bVar7 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar140._16_4_ = bVar7 * uVar150 | !bVar7 * auVar140._16_4_;
          bVar7 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar140._20_4_ = bVar7 * uVar151 | !bVar7 * auVar140._20_4_;
          bVar7 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar140._24_4_ = bVar7 * uVar152 | !bVar7 * auVar140._24_4_;
          bVar7 = SUB81(uVar78 >> 7,0);
          auVar140._28_4_ = bVar7 * uVar153 | !bVar7 * auVar140._28_4_;
          auVar108 = vblendmps_avx512vl(auVar255,auVar250);
          bVar7 = (bool)((byte)(uVar73 >> 1) & 1);
          bVar9 = (bool)((byte)(uVar73 >> 2) & 1);
          bVar10 = (bool)((byte)(uVar73 >> 3) & 1);
          bVar11 = (bool)((byte)(uVar73 >> 4) & 1);
          bVar12 = (bool)((byte)(uVar73 >> 5) & 1);
          bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
          bVar14 = SUB81(uVar73 >> 7,0);
          auVar141._0_4_ =
               (uint)(bVar75 & 1) *
               ((uint)(bVar81 & 1) * auVar108._0_4_ | !(bool)(bVar81 & 1) * uVar82) |
               !(bool)(bVar75 & 1) * auVar141._0_4_;
          bVar8 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar141._4_4_ =
               (uint)bVar8 * ((uint)bVar7 * auVar108._4_4_ | !bVar7 * uVar147) |
               !bVar8 * auVar141._4_4_;
          bVar7 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar141._8_4_ =
               (uint)bVar7 * ((uint)bVar9 * auVar108._8_4_ | !bVar9 * uVar148) |
               !bVar7 * auVar141._8_4_;
          bVar7 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar141._12_4_ =
               (uint)bVar7 * ((uint)bVar10 * auVar108._12_4_ | !bVar10 * uVar149) |
               !bVar7 * auVar141._12_4_;
          bVar7 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar141._16_4_ =
               (uint)bVar7 * ((uint)bVar11 * auVar108._16_4_ | !bVar11 * uVar150) |
               !bVar7 * auVar141._16_4_;
          bVar7 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar141._20_4_ =
               (uint)bVar7 * ((uint)bVar12 * auVar108._20_4_ | !bVar12 * uVar151) |
               !bVar7 * auVar141._20_4_;
          bVar7 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar141._24_4_ =
               (uint)bVar7 * ((uint)bVar13 * auVar108._24_4_ | !bVar13 * uVar152) |
               !bVar7 * auVar141._24_4_;
          bVar7 = SUB81(uVar78 >> 7,0);
          auVar141._28_4_ =
               (uint)bVar7 * ((uint)bVar14 * auVar108._28_4_ | !bVar14 * uVar153) |
               !bVar7 * auVar141._28_4_;
          bVar74 = (~bVar75 | bVar81) & bVar74;
        }
      }
      auVar268 = ZEXT3264(local_5e0);
      auVar251._0_4_ = local_5e0._0_4_ * auVar245._0_4_;
      auVar251._4_4_ = local_5e0._4_4_ * auVar245._4_4_;
      auVar251._8_4_ = local_5e0._8_4_ * auVar245._8_4_;
      auVar251._12_4_ = local_5e0._12_4_ * auVar245._12_4_;
      auVar251._16_4_ = local_5e0._16_4_ * auVar245._16_4_;
      auVar251._20_4_ = local_5e0._20_4_ * auVar245._20_4_;
      auVar251._28_36_ = auVar245._28_36_;
      auVar251._24_4_ = local_5e0._24_4_ * auVar245._24_4_;
      auVar256 = ZEXT3264(local_5c0);
      auVar86 = vfmadd231ps_fma(auVar251._0_32_,local_5c0,auVar99);
      auVar251 = ZEXT3264(local_5a0);
      auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),local_5a0,auVar97);
      auVar265 = ZEXT3264(_local_680);
      _local_200 = _local_680;
      local_1e0 = vminps_avx(local_360,auVar140);
      auVar247._8_4_ = 0x7fffffff;
      auVar247._0_8_ = 0x7fffffff7fffffff;
      auVar247._12_4_ = 0x7fffffff;
      auVar247._16_4_ = 0x7fffffff;
      auVar247._20_4_ = 0x7fffffff;
      auVar247._24_4_ = 0x7fffffff;
      auVar247._28_4_ = 0x7fffffff;
      auVar108 = vandps_avx(ZEXT1632(auVar86),auVar247);
      local_380 = vmaxps_avx(_local_680,auVar141);
      auVar245 = ZEXT3264(local_380);
      auVar166._8_4_ = 0x3e99999a;
      auVar166._0_8_ = 0x3e99999a3e99999a;
      auVar166._12_4_ = 0x3e99999a;
      auVar166._16_4_ = 0x3e99999a;
      auVar166._20_4_ = 0x3e99999a;
      auVar166._24_4_ = 0x3e99999a;
      auVar166._28_4_ = 0x3e99999a;
      uVar17 = vcmpps_avx512vl(auVar108,auVar166,1);
      local_580._0_2_ = (short)uVar17;
      uVar17 = vcmpps_avx512vl(_local_680,local_1e0,2);
      bVar75 = (byte)uVar17 & bVar70;
      uVar18 = vcmpps_avx512vl(local_380,local_360,2);
      auVar270 = ZEXT3264(local_8e0);
      auVar271 = ZEXT3264(local_900);
      if ((bVar70 & ((byte)uVar18 | (byte)uVar17)) == 0) {
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar274 = ZEXT3264(auVar108);
      }
      else {
        auVar55._4_4_ = local_5e0._4_4_ * auVar263._4_4_;
        auVar55._0_4_ = local_5e0._0_4_ * auVar263._0_4_;
        auVar55._8_4_ = local_5e0._8_4_ * auVar263._8_4_;
        auVar55._12_4_ = local_5e0._12_4_ * auVar263._12_4_;
        auVar55._16_4_ = local_5e0._16_4_ * auVar263._16_4_;
        auVar55._20_4_ = local_5e0._20_4_ * auVar263._20_4_;
        auVar55._24_4_ = local_5e0._24_4_ * auVar263._24_4_;
        auVar55._28_4_ = 0x3e99999a;
        auVar86 = vfmadd213ps_fma(auVar114,local_5c0,auVar55);
        auVar86 = vfmadd213ps_fma(auVar109,local_5a0,ZEXT1632(auVar86));
        auVar108 = vandps_avx(ZEXT1632(auVar86),auVar247);
        uVar17 = vcmpps_avx512vl(auVar108,auVar166,1);
        bVar81 = (byte)uVar17 | ~bVar74;
        auVar167._8_4_ = 2;
        auVar167._0_8_ = 0x200000002;
        auVar167._12_4_ = 2;
        auVar167._16_4_ = 2;
        auVar167._20_4_ = 2;
        auVar167._24_4_ = 2;
        auVar167._28_4_ = 2;
        auVar29._8_4_ = 3;
        auVar29._0_8_ = 0x300000003;
        auVar29._12_4_ = 3;
        auVar29._16_4_ = 3;
        auVar29._20_4_ = 3;
        auVar29._24_4_ = 3;
        auVar29._28_4_ = 3;
        auVar108 = vpblendmd_avx512vl(auVar167,auVar29);
        local_320._0_4_ = (uint)(bVar81 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar81 & 1) * 2;
        bVar7 = (bool)(bVar81 >> 1 & 1);
        local_320._4_4_ = (uint)bVar7 * auVar108._4_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar81 >> 2 & 1);
        local_320._8_4_ = (uint)bVar7 * auVar108._8_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar81 >> 3 & 1);
        local_320._12_4_ = (uint)bVar7 * auVar108._12_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar81 >> 4 & 1);
        local_320._16_4_ = (uint)bVar7 * auVar108._16_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar81 >> 5 & 1);
        local_320._20_4_ = (uint)bVar7 * auVar108._20_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar81 >> 6 & 1);
        local_320._24_4_ = (uint)bVar7 * auVar108._24_4_ | (uint)!bVar7 * 2;
        local_320._28_4_ = (uint)(bVar81 >> 7) * auVar108._28_4_ | (uint)!(bool)(bVar81 >> 7) * 2;
        local_500 = vpbroadcastd_avx512vl();
        uVar17 = vpcmpd_avx512vl(local_500,local_320,5);
        bVar81 = (byte)uVar17 & bVar75;
        if (bVar81 == 0) {
          auVar169._4_4_ = uVar83;
          auVar169._0_4_ = uVar83;
          auVar169._8_4_ = uVar83;
          auVar169._12_4_ = uVar83;
          auVar169._16_4_ = uVar83;
          auVar169._20_4_ = uVar83;
          auVar169._24_4_ = uVar83;
          auVar169._28_4_ = uVar83;
        }
        else {
          local_340 = local_380;
          auVar91 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
          auVar86 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
          auVar84 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar96 = vminps_avx(auVar91,auVar84);
          auVar91 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar84 = vmaxps_avx(auVar86,auVar91);
          auVar194._8_4_ = 0x7fffffff;
          auVar194._0_8_ = 0x7fffffff7fffffff;
          auVar194._12_4_ = 0x7fffffff;
          auVar86 = vandps_avx(auVar96,auVar194);
          auVar91 = vandps_avx(auVar84,auVar194);
          auVar86 = vmaxps_avx(auVar86,auVar91);
          auVar91 = vmovshdup_avx(auVar86);
          auVar91 = vmaxss_avx(auVar91,auVar86);
          auVar86 = vshufpd_avx(auVar86,auVar86,1);
          auVar86 = vmaxss_avx(auVar86,auVar91);
          local_860._0_4_ = auVar86._0_4_ * 1.9073486e-06;
          local_6e0 = vshufps_avx(auVar84,auVar84,0xff);
          local_560 = (float)local_680._0_4_ + (float)local_7e0._0_4_;
          fStack_55c = (float)local_680._4_4_ + (float)local_7e0._4_4_;
          fStack_558 = fStack_678 + fStack_7d8;
          fStack_554 = fStack_674 + fStack_7d4;
          fStack_550 = fStack_670 + fStack_7d0;
          fStack_54c = fStack_66c + fStack_7cc;
          fStack_548 = fStack_668 + fStack_7c8;
          fStack_544 = fStack_664 + fStack_7c4;
          do {
            auVar168._8_4_ = 0x7f800000;
            auVar168._0_8_ = 0x7f8000007f800000;
            auVar168._12_4_ = 0x7f800000;
            auVar168._16_4_ = 0x7f800000;
            auVar168._20_4_ = 0x7f800000;
            auVar168._24_4_ = 0x7f800000;
            auVar168._28_4_ = 0x7f800000;
            auVar108 = vblendmps_avx512vl(auVar168,_local_680);
            auVar143._0_4_ =
                 (uint)(bVar81 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar81 & 1) * 0x7f800000;
            bVar7 = (bool)(bVar81 >> 1 & 1);
            auVar143._4_4_ = (uint)bVar7 * auVar108._4_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar81 >> 2 & 1);
            auVar143._8_4_ = (uint)bVar7 * auVar108._8_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar81 >> 3 & 1);
            auVar143._12_4_ = (uint)bVar7 * auVar108._12_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar81 >> 4 & 1);
            auVar143._16_4_ = (uint)bVar7 * auVar108._16_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar81 >> 5 & 1);
            auVar143._20_4_ = (uint)bVar7 * auVar108._20_4_ | (uint)!bVar7 * 0x7f800000;
            auVar143._24_4_ =
                 (uint)(bVar81 >> 6) * auVar108._24_4_ | (uint)!(bool)(bVar81 >> 6) * 0x7f800000;
            auVar143._28_4_ = 0x7f800000;
            auVar108 = vshufps_avx(auVar143,auVar143,0xb1);
            auVar108 = vminps_avx(auVar143,auVar108);
            auVar109 = vshufpd_avx(auVar108,auVar108,5);
            auVar108 = vminps_avx(auVar108,auVar109);
            auVar109 = vpermpd_avx2(auVar108,0x4e);
            auVar108 = vminps_avx(auVar108,auVar109);
            uVar17 = vcmpps_avx512vl(auVar143,auVar108,0);
            bVar71 = (byte)uVar17 & bVar81;
            bVar72 = bVar81;
            if (bVar71 != 0) {
              bVar72 = bVar71;
            }
            iVar20 = 0;
            for (uVar83 = (uint)bVar72; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
              iVar20 = iVar20 + 1;
            }
            uVar83 = *(uint *)(local_200 + (uint)(iVar20 << 2));
            fVar252 = auVar16._0_4_;
            auVar86 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar20 << 2)));
            if ((float)local_800._0_4_ < 0.0) {
              local_880._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar20 << 2)));
              fVar252 = sqrtf((float)local_800._0_4_);
              auVar86 = local_880._0_16_;
            }
            auVar86 = vinsertps_avx(ZEXT416(uVar83),auVar86,0x10);
            auVar261 = ZEXT1664(auVar86);
            lVar80 = 5;
            do {
              uVar177 = auVar261._0_4_;
              auVar156._4_4_ = uVar177;
              auVar156._0_4_ = uVar177;
              auVar156._8_4_ = uVar177;
              auVar156._12_4_ = uVar177;
              auVar86 = vfmadd132ps_fma(auVar156,ZEXT816(0) << 0x40,local_7f0);
              local_740 = auVar261._0_32_;
              auVar91 = vmovshdup_avx(auVar261._0_16_);
              fVar231 = auVar91._0_4_;
              fVar230 = 1.0 - fVar231;
              fVar259 = fVar230 * fVar230 * fVar230;
              fVar257 = fVar231 * fVar231;
              fVar232 = fVar257 * fVar231;
              auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar259),
                                        ZEXT416((uint)fVar232));
              fVar258 = fVar231 * fVar230;
              local_880._0_16_ = ZEXT416((uint)fVar230);
              auVar92 = vfmadd231ss_fma(ZEXT416((uint)(fVar258 * fVar231 * 6.0)),
                                        ZEXT416((uint)(fVar258 * fVar230)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar232),
                                        ZEXT416((uint)fVar259));
              auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar258 * fVar230 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar258 * fVar231)));
              fVar259 = fVar259 * 0.16666667;
              fVar230 = (auVar84._0_4_ + auVar92._0_4_) * 0.16666667;
              fVar231 = (auVar96._0_4_ + auVar85._0_4_) * 0.16666667;
              fVar232 = fVar232 * 0.16666667;
              auVar195._0_4_ = fVar232 * (float)local_7c0._0_4_;
              auVar195._4_4_ = fVar232 * (float)local_7c0._4_4_;
              auVar195._8_4_ = fVar232 * fStack_7b8;
              auVar195._12_4_ = fVar232 * fStack_7b4;
              auVar234._4_4_ = fVar231;
              auVar234._0_4_ = fVar231;
              auVar234._8_4_ = fVar231;
              auVar234._12_4_ = fVar231;
              auVar84 = vfmadd132ps_fma(auVar234,auVar195,local_780._0_16_);
              auVar196._4_4_ = fVar230;
              auVar196._0_4_ = fVar230;
              auVar196._8_4_ = fVar230;
              auVar196._12_4_ = fVar230;
              auVar84 = vfmadd132ps_fma(auVar196,auVar84,local_7a0._0_16_);
              auVar179._4_4_ = fVar259;
              auVar179._0_4_ = fVar259;
              auVar179._8_4_ = fVar259;
              auVar179._12_4_ = fVar259;
              auVar84 = vfmadd132ps_fma(auVar179,auVar84,local_760._0_16_);
              local_600._0_16_ = auVar84;
              auVar84 = vsubps_avx(auVar86,auVar84);
              auVar86 = vdpps_avx(auVar84,auVar84,0x7f);
              local_820._0_16_ = auVar86;
              if (auVar86._0_4_ < 0.0) {
                local_8a0._0_4_ = fVar257;
                local_8c0._0_4_ = fVar258;
                auVar245._0_4_ = sqrtf(auVar86._0_4_);
                auVar245._4_60_ = extraout_var;
                auVar86 = auVar245._0_16_;
                fVar258 = (float)local_8c0._0_4_;
              }
              else {
                auVar86 = vsqrtss_avx(auVar86,auVar86);
                local_8a0._0_4_ = fVar257;
              }
              local_620._4_4_ = local_880._0_4_;
              local_620._0_4_ = local_620._4_4_;
              fStack_618 = (float)local_620._4_4_;
              fStack_614 = (float)local_620._4_4_;
              auVar92 = vfnmsub213ss_fma(auVar91,auVar91,ZEXT416((uint)(fVar258 * 4.0)));
              auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar258 * 4.0)),local_880._0_16_,
                                        local_880._0_16_);
              fVar257 = (float)local_620._4_4_ * -(float)local_620._4_4_ * 0.5;
              fVar258 = auVar92._0_4_ * 0.5;
              fVar259 = auVar96._0_4_ * 0.5;
              local_8a0._0_4_ = (float)local_8a0._0_4_ * 0.5;
              auVar215._0_4_ = (float)local_8a0._0_4_ * (float)local_7c0._0_4_;
              auVar215._4_4_ = (float)local_8a0._0_4_ * (float)local_7c0._4_4_;
              auVar215._8_4_ = (float)local_8a0._0_4_ * fStack_7b8;
              auVar215._12_4_ = (float)local_8a0._0_4_ * fStack_7b4;
              auVar180._4_4_ = fVar259;
              auVar180._0_4_ = fVar259;
              auVar180._8_4_ = fVar259;
              auVar180._12_4_ = fVar259;
              auVar96 = vfmadd132ps_fma(auVar180,auVar215,local_780._0_16_);
              auVar197._4_4_ = fVar258;
              auVar197._0_4_ = fVar258;
              auVar197._8_4_ = fVar258;
              auVar197._12_4_ = fVar258;
              auVar96 = vfmadd132ps_fma(auVar197,auVar96,local_7a0._0_16_);
              auVar266._4_4_ = fVar257;
              auVar266._0_4_ = fVar257;
              auVar266._8_4_ = fVar257;
              auVar266._12_4_ = fVar257;
              _local_8a0 = vfmadd132ps_fma(auVar266,auVar96,local_760._0_16_);
              local_640._0_16_ = vdpps_avx(_local_8a0,_local_8a0,0x7f);
              auVar57._12_4_ = 0;
              auVar57._0_12_ = ZEXT812(0);
              fVar257 = local_640._0_4_;
              local_850 = vrsqrt14ss_avx512f(auVar57 << 0x20,ZEXT416((uint)fVar257));
              fVar258 = local_850._0_4_;
              local_660._0_16_ = vrcp14ss_avx512f(auVar57 << 0x20,ZEXT416((uint)fVar257));
              auVar96 = vfnmadd213ss_fma(local_660._0_16_,local_640._0_16_,ZEXT416(0x40000000));
              local_840._0_4_ = auVar96._0_4_;
              local_8c0._0_4_ = auVar86._0_4_;
              if (fVar257 < -fVar257) {
                fVar259 = sqrtf(fVar257);
                auVar86 = ZEXT416((uint)local_8c0._0_4_);
                auVar96 = _local_8a0;
              }
              else {
                auVar96 = vsqrtss_avx(local_640._0_16_,local_640._0_16_);
                fVar259 = auVar96._0_4_;
                auVar96 = _local_8a0;
              }
              fVar230 = local_850._0_4_;
              fVar257 = fVar258 * 1.5 + fVar257 * -0.5 * fVar230 * fVar230 * fVar230;
              local_850._0_4_ = auVar96._0_4_ * fVar257;
              local_850._4_4_ = auVar96._4_4_ * fVar257;
              local_850._8_4_ = auVar96._8_4_ * fVar257;
              local_850._12_4_ = auVar96._12_4_ * fVar257;
              auVar92 = vdpps_avx(auVar84,local_850,0x7f);
              fVar231 = auVar86._0_4_;
              fVar258 = auVar92._0_4_;
              auVar157._0_4_ = fVar258 * fVar258;
              auVar157._4_4_ = auVar92._4_4_ * auVar92._4_4_;
              auVar157._8_4_ = auVar92._8_4_ * auVar92._8_4_;
              auVar157._12_4_ = auVar92._12_4_ * auVar92._12_4_;
              auVar85 = vsubps_avx(local_820._0_16_,auVar157);
              fVar230 = auVar85._0_4_;
              auVar181._4_12_ = ZEXT812(0) << 0x20;
              auVar181._0_4_ = fVar230;
              auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar181);
              auVar88 = vmulss_avx512f(auVar87,ZEXT416(0x3fc00000));
              auVar89 = vmulss_avx512f(auVar85,ZEXT416(0xbf000000));
              if (fVar230 < 0.0) {
                local_6a0._0_4_ = fVar259;
                local_6c0._0_4_ = auVar88._0_4_;
                local_6d0._4_4_ = fVar257;
                local_6d0._0_4_ = fVar257;
                fStack_6c8 = fVar257;
                fStack_6c4 = fVar257;
                local_6b0 = auVar87;
                fVar230 = sqrtf(fVar230);
                auVar89 = ZEXT416(auVar89._0_4_);
                auVar88 = ZEXT416((uint)local_6c0._0_4_);
                auVar86 = ZEXT416((uint)local_8c0._0_4_);
                auVar87 = local_6b0;
                auVar96 = _local_8a0;
                fVar257 = (float)local_6d0._0_4_;
                fVar232 = (float)local_6d0._4_4_;
                fVar214 = fStack_6c8;
                fVar233 = fStack_6c4;
                fVar259 = (float)local_6a0._0_4_;
              }
              else {
                auVar85 = vsqrtss_avx(auVar85,auVar85);
                fVar230 = auVar85._0_4_;
                fVar232 = fVar257;
                fVar214 = fVar257;
                fVar233 = fVar257;
              }
              auVar268 = ZEXT1664(auVar96);
              auVar265 = ZEXT1664(local_820._0_16_);
              auVar263 = ZEXT1664(auVar84);
              auVar270 = ZEXT3264(local_8e0);
              auVar271 = ZEXT3264(local_900);
              auVar272 = ZEXT3264(local_920);
              auVar273 = ZEXT3264(local_940);
              auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_880._0_16_,auVar91);
              auVar93 = vfmadd213ss_fma(auVar91,SUB6416(ZEXT464(0xc0000000),0),local_880._0_16_);
              auVar95 = local_740._0_16_;
              auVar91 = vshufps_avx(auVar95,auVar95,0x55);
              auVar198._0_4_ = auVar91._0_4_ * (float)local_7c0._0_4_;
              auVar198._4_4_ = auVar91._4_4_ * (float)local_7c0._4_4_;
              auVar198._8_4_ = auVar91._8_4_ * fStack_7b8;
              auVar198._12_4_ = auVar91._12_4_ * fStack_7b4;
              auVar216._0_4_ = auVar93._0_4_;
              auVar216._4_4_ = auVar216._0_4_;
              auVar216._8_4_ = auVar216._0_4_;
              auVar216._12_4_ = auVar216._0_4_;
              auVar91 = vfmadd132ps_fma(auVar216,auVar198,local_780._0_16_);
              auVar182._0_4_ = auVar85._0_4_;
              auVar182._4_4_ = auVar182._0_4_;
              auVar182._8_4_ = auVar182._0_4_;
              auVar182._12_4_ = auVar182._0_4_;
              auVar91 = vfmadd132ps_fma(auVar182,auVar91,local_7a0._0_16_);
              auVar91 = vfmadd132ps_fma(_local_620,auVar91,local_760._0_16_);
              auVar183._0_4_ = auVar91._0_4_ * (float)local_640._0_4_;
              auVar183._4_4_ = auVar91._4_4_ * (float)local_640._0_4_;
              auVar183._8_4_ = auVar91._8_4_ * (float)local_640._0_4_;
              auVar183._12_4_ = auVar91._12_4_ * (float)local_640._0_4_;
              auVar91 = vdpps_avx(auVar96,auVar91,0x7f);
              fVar240 = auVar91._0_4_;
              auVar199._0_4_ = auVar96._0_4_ * fVar240;
              auVar199._4_4_ = auVar96._4_4_ * fVar240;
              auVar199._8_4_ = auVar96._8_4_ * fVar240;
              auVar199._12_4_ = auVar96._12_4_ * fVar240;
              auVar91 = vsubps_avx(auVar183,auVar199);
              fVar240 = (float)local_840._0_4_ * (float)local_660._0_4_;
              auVar93 = vmaxss_avx(ZEXT416((uint)local_860._0_4_),
                                   ZEXT416((uint)(local_740._0_4_ * fVar252 * 1.9073486e-06)));
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar90 = vxorps_avx512vl(auVar96,auVar21);
              auVar200._0_4_ = fVar257 * auVar91._0_4_ * fVar240;
              auVar200._4_4_ = fVar232 * auVar91._4_4_ * fVar240;
              auVar200._8_4_ = fVar214 * auVar91._8_4_ * fVar240;
              auVar200._12_4_ = fVar233 * auVar91._12_4_ * fVar240;
              auVar91 = vdpps_avx(auVar90,local_850,0x7f);
              auVar85 = vfmadd213ss_fma(auVar86,ZEXT416((uint)local_860._0_4_),auVar93);
              auVar86 = vdpps_avx(auVar84,auVar200,0x7f);
              auVar94 = vfmadd213ss_fma(ZEXT416((uint)(fVar231 + 1.0)),
                                        ZEXT416((uint)((float)local_860._0_4_ / fVar259)),auVar85);
              fVar257 = auVar91._0_4_ + auVar86._0_4_;
              auVar86 = vdpps_avx(local_7f0,local_850,0x7f);
              auVar91 = vdpps_avx(auVar84,auVar90,0x7f);
              auVar85 = vmulss_avx512f(auVar89,auVar87);
              auVar89 = vaddss_avx512f(auVar88,ZEXT416((uint)(auVar85._0_4_ *
                                                             auVar87._0_4_ * auVar87._0_4_)));
              auVar85 = vdpps_avx(auVar84,local_7f0,0x7f);
              auVar88 = vfnmadd231ss_fma(auVar91,auVar92,ZEXT416((uint)fVar257));
              auVar85 = vfnmadd231ss_fma(auVar85,auVar92,auVar86);
              auVar91 = vpermilps_avx(local_600._0_16_,0xff);
              fVar230 = fVar230 - auVar91._0_4_;
              auVar87 = vshufps_avx(auVar96,auVar96,0xff);
              auVar91 = vfmsub213ss_fma(auVar88,auVar89,auVar87);
              auVar253._8_4_ = 0x80000000;
              auVar253._0_8_ = 0x8000000080000000;
              auVar253._12_4_ = 0x80000000;
              auVar256 = ZEXT1664(auVar253);
              auVar248._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
              auVar248._8_4_ = auVar91._8_4_ ^ 0x80000000;
              auVar248._12_4_ = auVar91._12_4_ ^ 0x80000000;
              auVar251 = ZEXT1664(auVar248);
              auVar85 = ZEXT416((uint)(auVar85._0_4_ * auVar89._0_4_));
              auVar88 = vfmsub231ss_fma(ZEXT416((uint)(auVar86._0_4_ * auVar91._0_4_)),
                                        ZEXT416((uint)fVar257),auVar85);
              auVar91 = vinsertps_avx(auVar248,auVar85,0x1c);
              auVar243._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
              auVar243._8_4_ = auVar86._8_4_ ^ 0x80000000;
              auVar243._12_4_ = auVar86._12_4_ ^ 0x80000000;
              auVar85 = vinsertps_avx(ZEXT416((uint)fVar257),auVar243,0x10);
              auVar217._0_4_ = auVar88._0_4_;
              auVar217._4_4_ = auVar217._0_4_;
              auVar217._8_4_ = auVar217._0_4_;
              auVar217._12_4_ = auVar217._0_4_;
              auVar86 = vdivps_avx(auVar91,auVar217);
              auVar91 = vdivps_avx(auVar85,auVar217);
              auVar218._0_4_ = fVar258 * auVar86._0_4_ + fVar230 * auVar91._0_4_;
              auVar218._4_4_ = fVar258 * auVar86._4_4_ + fVar230 * auVar91._4_4_;
              auVar218._8_4_ = fVar258 * auVar86._8_4_ + fVar230 * auVar91._8_4_;
              auVar218._12_4_ = fVar258 * auVar86._12_4_ + fVar230 * auVar91._12_4_;
              auVar86 = vsubps_avx(auVar95,auVar218);
              auVar261 = ZEXT1664(auVar86);
              auVar22._8_4_ = 0x7fffffff;
              auVar22._0_8_ = 0x7fffffff7fffffff;
              auVar22._12_4_ = 0x7fffffff;
              auVar91 = vandps_avx512vl(auVar92,auVar22);
              if (auVar91._0_4_ < auVar94._0_4_) {
                auVar91 = vfmadd231ss_fma(ZEXT416((uint)(auVar94._0_4_ + auVar93._0_4_)),local_6e0,
                                          ZEXT416(0x36000000));
                auVar23._8_4_ = 0x7fffffff;
                auVar23._0_8_ = 0x7fffffff7fffffff;
                auVar23._12_4_ = 0x7fffffff;
                auVar92 = vandps_avx512vl(ZEXT416((uint)fVar230),auVar23);
                if (auVar92._0_4_ < auVar91._0_4_) {
                  fVar252 = auVar86._0_4_ + (float)local_6f0._0_4_;
                  if ((fVar252 < fVar154) ||
                     (fVar257 = *(float *)(ray + k * 4 + 0x100), fVar257 < fVar252)) break;
                  auVar91 = vmovshdup_avx(auVar86);
                  fVar258 = auVar91._0_4_;
                  if ((fVar258 < 0.0) || (1.0 < fVar258)) break;
                  auVar91 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_820._0_4_));
                  fVar259 = auVar91._0_4_;
                  pGVar4 = (context->scene->geometries).items[uVar79].ptr;
                  if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                  fVar259 = fVar259 * 1.5 + local_820._0_4_ * -0.5 * fVar259 * fVar259 * fVar259;
                  auVar219._0_4_ = auVar84._0_4_ * fVar259;
                  auVar219._4_4_ = auVar84._4_4_ * fVar259;
                  auVar219._8_4_ = auVar84._8_4_ * fVar259;
                  auVar219._12_4_ = auVar84._12_4_ * fVar259;
                  auVar87 = vfmadd213ps_fma(auVar87,auVar219,auVar96);
                  auVar91 = vshufps_avx(auVar219,auVar219,0xc9);
                  auVar92 = vshufps_avx(auVar96,auVar96,0xc9);
                  auVar220._0_4_ = auVar219._0_4_ * auVar92._0_4_;
                  auVar220._4_4_ = auVar219._4_4_ * auVar92._4_4_;
                  auVar220._8_4_ = auVar219._8_4_ * auVar92._8_4_;
                  auVar220._12_4_ = auVar219._12_4_ * auVar92._12_4_;
                  auVar85 = vfmsub231ps_fma(auVar220,auVar96,auVar91);
                  auVar91 = vshufps_avx(auVar85,auVar85,0xc9);
                  auVar92 = vshufps_avx(auVar87,auVar87,0xc9);
                  auVar85 = vshufps_avx(auVar85,auVar85,0xd2);
                  auVar158._0_4_ = auVar87._0_4_ * auVar85._0_4_;
                  auVar158._4_4_ = auVar87._4_4_ * auVar85._4_4_;
                  auVar158._8_4_ = auVar87._8_4_ * auVar85._8_4_;
                  auVar158._12_4_ = auVar87._12_4_ * auVar85._12_4_;
                  auVar91 = vfmsub231ps_fma(auVar158,auVar91,auVar92);
                  uVar177 = auVar91._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar252;
                    uVar3 = vextractps_avx(auVar91,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar3;
                    uVar3 = vextractps_avx(auVar91,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar3;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar177;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar258;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(uint *)(ray + k * 4 + 0x220) = uVar2;
                    *(uint *)(ray + k * 4 + 0x240) = uVar79;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar6 = context->user;
                  auVar228._8_4_ = 1;
                  auVar228._0_8_ = 0x100000001;
                  auVar228._12_4_ = 1;
                  auVar228._16_4_ = 1;
                  auVar228._20_4_ = 1;
                  auVar228._24_4_ = 1;
                  auVar228._28_4_ = 1;
                  local_440 = vpermps_avx2(auVar228,ZEXT1632(auVar86));
                  auVar108 = vpermps_avx2(auVar228,ZEXT1632(auVar91));
                  auVar238._8_4_ = 2;
                  auVar238._0_8_ = 0x200000002;
                  auVar238._12_4_ = 2;
                  auVar238._16_4_ = 2;
                  auVar238._20_4_ = 2;
                  auVar238._24_4_ = 2;
                  auVar238._28_4_ = 2;
                  local_480 = vpermps_avx2(auVar238,ZEXT1632(auVar91));
                  local_4a0[0] = (RTCHitN)auVar108[0];
                  local_4a0[1] = (RTCHitN)auVar108[1];
                  local_4a0[2] = (RTCHitN)auVar108[2];
                  local_4a0[3] = (RTCHitN)auVar108[3];
                  local_4a0[4] = (RTCHitN)auVar108[4];
                  local_4a0[5] = (RTCHitN)auVar108[5];
                  local_4a0[6] = (RTCHitN)auVar108[6];
                  local_4a0[7] = (RTCHitN)auVar108[7];
                  local_4a0[8] = (RTCHitN)auVar108[8];
                  local_4a0[9] = (RTCHitN)auVar108[9];
                  local_4a0[10] = (RTCHitN)auVar108[10];
                  local_4a0[0xb] = (RTCHitN)auVar108[0xb];
                  local_4a0[0xc] = (RTCHitN)auVar108[0xc];
                  local_4a0[0xd] = (RTCHitN)auVar108[0xd];
                  local_4a0[0xe] = (RTCHitN)auVar108[0xe];
                  local_4a0[0xf] = (RTCHitN)auVar108[0xf];
                  local_4a0[0x10] = (RTCHitN)auVar108[0x10];
                  local_4a0[0x11] = (RTCHitN)auVar108[0x11];
                  local_4a0[0x12] = (RTCHitN)auVar108[0x12];
                  local_4a0[0x13] = (RTCHitN)auVar108[0x13];
                  local_4a0[0x14] = (RTCHitN)auVar108[0x14];
                  local_4a0[0x15] = (RTCHitN)auVar108[0x15];
                  local_4a0[0x16] = (RTCHitN)auVar108[0x16];
                  local_4a0[0x17] = (RTCHitN)auVar108[0x17];
                  local_4a0[0x18] = (RTCHitN)auVar108[0x18];
                  local_4a0[0x19] = (RTCHitN)auVar108[0x19];
                  local_4a0[0x1a] = (RTCHitN)auVar108[0x1a];
                  local_4a0[0x1b] = (RTCHitN)auVar108[0x1b];
                  local_4a0[0x1c] = (RTCHitN)auVar108[0x1c];
                  local_4a0[0x1d] = (RTCHitN)auVar108[0x1d];
                  local_4a0[0x1e] = (RTCHitN)auVar108[0x1e];
                  local_4a0[0x1f] = (RTCHitN)auVar108[0x1f];
                  local_460 = uVar177;
                  uStack_45c = uVar177;
                  uStack_458 = uVar177;
                  uStack_454 = uVar177;
                  uStack_450 = uVar177;
                  uStack_44c = uVar177;
                  uStack_448 = uVar177;
                  uStack_444 = uVar177;
                  local_420 = ZEXT432(0) << 0x20;
                  local_400 = local_4e0._0_8_;
                  uStack_3f8 = local_4e0._8_8_;
                  uStack_3f0 = local_4e0._16_8_;
                  uStack_3e8 = local_4e0._24_8_;
                  local_3e0 = local_4c0;
                  auVar108 = vpcmpeqd_avx2(local_4c0,local_4c0);
                  local_828[1] = auVar108;
                  *local_828 = auVar108;
                  local_3c0 = pRVar6->instID[0];
                  uStack_3bc = local_3c0;
                  uStack_3b8 = local_3c0;
                  uStack_3b4 = local_3c0;
                  uStack_3b0 = local_3c0;
                  uStack_3ac = local_3c0;
                  uStack_3a8 = local_3c0;
                  uStack_3a4 = local_3c0;
                  local_3a0 = pRVar6->instPrimID[0];
                  uStack_39c = local_3a0;
                  uStack_398 = local_3a0;
                  uStack_394 = local_3a0;
                  uStack_390 = local_3a0;
                  uStack_38c = local_3a0;
                  uStack_388 = local_3a0;
                  uStack_384 = local_3a0;
                  *(float *)(ray + k * 4 + 0x100) = fVar252;
                  local_720 = local_520;
                  local_970.valid = (int *)local_720;
                  local_970.geometryUserPtr = pGVar4->userPtr;
                  local_970.context = context->user;
                  local_970.hit = local_4a0;
                  local_970.N = 8;
                  local_970.ray = (RTCRayN *)ray;
                  if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar251 = ZEXT1664(auVar248);
                    auVar256 = ZEXT1664(auVar253);
                    auVar261 = ZEXT1664(auVar86);
                    auVar263 = ZEXT1664(auVar84);
                    auVar265 = ZEXT1664(local_820._0_16_);
                    auVar268 = ZEXT1664(auVar96);
                    (*pGVar4->intersectionFilterN)(&local_970);
                    auVar273 = ZEXT3264(local_940);
                    auVar272 = ZEXT3264(local_920);
                    auVar271 = ZEXT3264(local_900);
                    auVar270 = ZEXT3264(local_8e0);
                  }
                  if (local_720 != (undefined1  [32])0x0) {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar251 = ZEXT1664(auVar251._0_16_);
                      auVar256 = ZEXT1664(auVar256._0_16_);
                      auVar261 = ZEXT1664(auVar261._0_16_);
                      auVar263 = ZEXT1664(auVar263._0_16_);
                      auVar265 = ZEXT1664(auVar265._0_16_);
                      auVar268 = ZEXT1664(auVar268._0_16_);
                      (*p_Var5)(&local_970);
                      auVar273 = ZEXT3264(local_940);
                      auVar272 = ZEXT3264(local_920);
                      auVar271 = ZEXT3264(local_900);
                      auVar270 = ZEXT3264(local_8e0);
                    }
                    if (local_720 != (undefined1  [32])0x0) {
                      uVar78 = vptestmd_avx512vl(local_720,local_720);
                      iVar59 = *(int *)(local_970.hit + 4);
                      iVar60 = *(int *)(local_970.hit + 8);
                      iVar61 = *(int *)(local_970.hit + 0xc);
                      iVar62 = *(int *)(local_970.hit + 0x10);
                      iVar63 = *(int *)(local_970.hit + 0x14);
                      iVar64 = *(int *)(local_970.hit + 0x18);
                      iVar65 = *(int *)(local_970.hit + 0x1c);
                      bVar72 = (byte)uVar78;
                      bVar7 = (bool)((byte)(uVar78 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar78 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar78 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar78 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar78 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar78 >> 6) & 1);
                      bVar13 = SUB81(uVar78 >> 7,0);
                      *(uint *)(local_970.ray + 0x180) =
                           (uint)(bVar72 & 1) * *(int *)local_970.hit |
                           (uint)!(bool)(bVar72 & 1) * *(int *)(local_970.ray + 0x180);
                      *(uint *)(local_970.ray + 0x184) =
                           (uint)bVar7 * iVar59 | (uint)!bVar7 * *(int *)(local_970.ray + 0x184);
                      *(uint *)(local_970.ray + 0x188) =
                           (uint)bVar8 * iVar60 | (uint)!bVar8 * *(int *)(local_970.ray + 0x188);
                      *(uint *)(local_970.ray + 0x18c) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_970.ray + 0x18c);
                      *(uint *)(local_970.ray + 400) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_970.ray + 400);
                      *(uint *)(local_970.ray + 0x194) =
                           (uint)bVar11 * iVar63 | (uint)!bVar11 * *(int *)(local_970.ray + 0x194);
                      *(uint *)(local_970.ray + 0x198) =
                           (uint)bVar12 * iVar64 | (uint)!bVar12 * *(int *)(local_970.ray + 0x198);
                      *(uint *)(local_970.ray + 0x19c) =
                           (uint)bVar13 * iVar65 | (uint)!bVar13 * *(int *)(local_970.ray + 0x19c);
                      iVar59 = *(int *)(local_970.hit + 0x24);
                      iVar60 = *(int *)(local_970.hit + 0x28);
                      iVar61 = *(int *)(local_970.hit + 0x2c);
                      iVar62 = *(int *)(local_970.hit + 0x30);
                      iVar63 = *(int *)(local_970.hit + 0x34);
                      iVar64 = *(int *)(local_970.hit + 0x38);
                      iVar65 = *(int *)(local_970.hit + 0x3c);
                      bVar7 = (bool)((byte)(uVar78 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar78 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar78 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar78 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar78 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar78 >> 6) & 1);
                      bVar13 = SUB81(uVar78 >> 7,0);
                      *(uint *)(local_970.ray + 0x1a0) =
                           (uint)(bVar72 & 1) * *(int *)(local_970.hit + 0x20) |
                           (uint)!(bool)(bVar72 & 1) * *(int *)(local_970.ray + 0x1a0);
                      *(uint *)(local_970.ray + 0x1a4) =
                           (uint)bVar7 * iVar59 | (uint)!bVar7 * *(int *)(local_970.ray + 0x1a4);
                      *(uint *)(local_970.ray + 0x1a8) =
                           (uint)bVar8 * iVar60 | (uint)!bVar8 * *(int *)(local_970.ray + 0x1a8);
                      *(uint *)(local_970.ray + 0x1ac) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_970.ray + 0x1ac);
                      *(uint *)(local_970.ray + 0x1b0) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_970.ray + 0x1b0);
                      *(uint *)(local_970.ray + 0x1b4) =
                           (uint)bVar11 * iVar63 | (uint)!bVar11 * *(int *)(local_970.ray + 0x1b4);
                      *(uint *)(local_970.ray + 0x1b8) =
                           (uint)bVar12 * iVar64 | (uint)!bVar12 * *(int *)(local_970.ray + 0x1b8);
                      *(uint *)(local_970.ray + 0x1bc) =
                           (uint)bVar13 * iVar65 | (uint)!bVar13 * *(int *)(local_970.ray + 0x1bc);
                      iVar59 = *(int *)(local_970.hit + 0x44);
                      iVar60 = *(int *)(local_970.hit + 0x48);
                      iVar61 = *(int *)(local_970.hit + 0x4c);
                      iVar62 = *(int *)(local_970.hit + 0x50);
                      iVar63 = *(int *)(local_970.hit + 0x54);
                      iVar64 = *(int *)(local_970.hit + 0x58);
                      iVar65 = *(int *)(local_970.hit + 0x5c);
                      bVar7 = (bool)((byte)(uVar78 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar78 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar78 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar78 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar78 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar78 >> 6) & 1);
                      bVar13 = SUB81(uVar78 >> 7,0);
                      *(uint *)(local_970.ray + 0x1c0) =
                           (uint)(bVar72 & 1) * *(int *)(local_970.hit + 0x40) |
                           (uint)!(bool)(bVar72 & 1) * *(int *)(local_970.ray + 0x1c0);
                      *(uint *)(local_970.ray + 0x1c4) =
                           (uint)bVar7 * iVar59 | (uint)!bVar7 * *(int *)(local_970.ray + 0x1c4);
                      *(uint *)(local_970.ray + 0x1c8) =
                           (uint)bVar8 * iVar60 | (uint)!bVar8 * *(int *)(local_970.ray + 0x1c8);
                      *(uint *)(local_970.ray + 0x1cc) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_970.ray + 0x1cc);
                      *(uint *)(local_970.ray + 0x1d0) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_970.ray + 0x1d0);
                      *(uint *)(local_970.ray + 0x1d4) =
                           (uint)bVar11 * iVar63 | (uint)!bVar11 * *(int *)(local_970.ray + 0x1d4);
                      *(uint *)(local_970.ray + 0x1d8) =
                           (uint)bVar12 * iVar64 | (uint)!bVar12 * *(int *)(local_970.ray + 0x1d8);
                      *(uint *)(local_970.ray + 0x1dc) =
                           (uint)bVar13 * iVar65 | (uint)!bVar13 * *(int *)(local_970.ray + 0x1dc);
                      iVar59 = *(int *)(local_970.hit + 100);
                      iVar60 = *(int *)(local_970.hit + 0x68);
                      iVar61 = *(int *)(local_970.hit + 0x6c);
                      iVar62 = *(int *)(local_970.hit + 0x70);
                      iVar63 = *(int *)(local_970.hit + 0x74);
                      iVar64 = *(int *)(local_970.hit + 0x78);
                      iVar65 = *(int *)(local_970.hit + 0x7c);
                      bVar7 = (bool)((byte)(uVar78 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar78 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar78 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar78 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar78 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar78 >> 6) & 1);
                      bVar13 = SUB81(uVar78 >> 7,0);
                      *(uint *)(local_970.ray + 0x1e0) =
                           (uint)(bVar72 & 1) * *(int *)(local_970.hit + 0x60) |
                           (uint)!(bool)(bVar72 & 1) * *(int *)(local_970.ray + 0x1e0);
                      *(uint *)(local_970.ray + 0x1e4) =
                           (uint)bVar7 * iVar59 | (uint)!bVar7 * *(int *)(local_970.ray + 0x1e4);
                      *(uint *)(local_970.ray + 0x1e8) =
                           (uint)bVar8 * iVar60 | (uint)!bVar8 * *(int *)(local_970.ray + 0x1e8);
                      *(uint *)(local_970.ray + 0x1ec) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_970.ray + 0x1ec);
                      *(uint *)(local_970.ray + 0x1f0) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_970.ray + 0x1f0);
                      *(uint *)(local_970.ray + 500) =
                           (uint)bVar11 * iVar63 | (uint)!bVar11 * *(int *)(local_970.ray + 500);
                      *(uint *)(local_970.ray + 0x1f8) =
                           (uint)bVar12 * iVar64 | (uint)!bVar12 * *(int *)(local_970.ray + 0x1f8);
                      *(uint *)(local_970.ray + 0x1fc) =
                           (uint)bVar13 * iVar65 | (uint)!bVar13 * *(int *)(local_970.ray + 0x1fc);
                      iVar59 = *(int *)(local_970.hit + 0x84);
                      iVar60 = *(int *)(local_970.hit + 0x88);
                      iVar61 = *(int *)(local_970.hit + 0x8c);
                      iVar62 = *(int *)(local_970.hit + 0x90);
                      iVar63 = *(int *)(local_970.hit + 0x94);
                      iVar64 = *(int *)(local_970.hit + 0x98);
                      iVar65 = *(int *)(local_970.hit + 0x9c);
                      bVar7 = (bool)((byte)(uVar78 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar78 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar78 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar78 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar78 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar78 >> 6) & 1);
                      bVar13 = SUB81(uVar78 >> 7,0);
                      *(uint *)(local_970.ray + 0x200) =
                           (uint)(bVar72 & 1) * *(int *)(local_970.hit + 0x80) |
                           (uint)!(bool)(bVar72 & 1) * *(int *)(local_970.ray + 0x200);
                      *(uint *)(local_970.ray + 0x204) =
                           (uint)bVar7 * iVar59 | (uint)!bVar7 * *(int *)(local_970.ray + 0x204);
                      *(uint *)(local_970.ray + 0x208) =
                           (uint)bVar8 * iVar60 | (uint)!bVar8 * *(int *)(local_970.ray + 0x208);
                      *(uint *)(local_970.ray + 0x20c) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_970.ray + 0x20c);
                      *(uint *)(local_970.ray + 0x210) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_970.ray + 0x210);
                      *(uint *)(local_970.ray + 0x214) =
                           (uint)bVar11 * iVar63 | (uint)!bVar11 * *(int *)(local_970.ray + 0x214);
                      *(uint *)(local_970.ray + 0x218) =
                           (uint)bVar12 * iVar64 | (uint)!bVar12 * *(int *)(local_970.ray + 0x218);
                      *(uint *)(local_970.ray + 0x21c) =
                           (uint)bVar13 * iVar65 | (uint)!bVar13 * *(int *)(local_970.ray + 0x21c);
                      auVar108 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_970.hit + 0xa0));
                      *(undefined1 (*) [32])(local_970.ray + 0x220) = auVar108;
                      auVar108 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_970.hit + 0xc0));
                      *(undefined1 (*) [32])(local_970.ray + 0x240) = auVar108;
                      auVar108 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_970.hit + 0xe0));
                      *(undefined1 (*) [32])(local_970.ray + 0x260) = auVar108;
                      auVar108 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_970.hit + 0x100));
                      *(undefined1 (*) [32])(local_970.ray + 0x280) = auVar108;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar257;
                  break;
                }
              }
              lVar80 = lVar80 + -1;
            } while (lVar80 != 0);
            uVar177 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar169._4_4_ = uVar177;
            auVar169._0_4_ = uVar177;
            auVar169._8_4_ = uVar177;
            auVar169._12_4_ = uVar177;
            auVar169._16_4_ = uVar177;
            auVar169._20_4_ = uVar177;
            auVar169._24_4_ = uVar177;
            auVar169._28_4_ = uVar177;
            auVar66._4_4_ = fStack_55c;
            auVar66._0_4_ = local_560;
            auVar66._8_4_ = fStack_558;
            auVar66._12_4_ = fStack_554;
            auVar66._16_4_ = fStack_550;
            auVar66._20_4_ = fStack_54c;
            auVar66._24_4_ = fStack_548;
            auVar66._28_4_ = fStack_544;
            uVar17 = vcmpps_avx512vl(auVar169,auVar66,0xd);
            bVar81 = ~('\x01' << ((byte)iVar20 & 0x1f)) & bVar81 & (byte)uVar17;
          } while (bVar81 != 0);
          auVar245 = ZEXT3264(local_340);
        }
        bVar74 = local_580[0] | ~bVar74;
        auVar191._0_4_ = (float)local_7e0._0_4_ + auVar245._0_4_;
        auVar191._4_4_ = (float)local_7e0._4_4_ + auVar245._4_4_;
        auVar191._8_4_ = fStack_7d8 + auVar245._8_4_;
        auVar191._12_4_ = fStack_7d4 + auVar245._12_4_;
        auVar191._16_4_ = fStack_7d0 + auVar245._16_4_;
        auVar191._20_4_ = fStack_7cc + auVar245._20_4_;
        auVar191._24_4_ = fStack_7c8 + auVar245._24_4_;
        auVar191._28_4_ = fStack_7c4 + auVar245._28_4_;
        uVar17 = vcmpps_avx512vl(auVar191,auVar169,2);
        bVar70 = (byte)uVar18 & bVar70 & (byte)uVar17;
        auVar192._8_4_ = 2;
        auVar192._0_8_ = 0x200000002;
        auVar192._12_4_ = 2;
        auVar192._16_4_ = 2;
        auVar192._20_4_ = 2;
        auVar192._24_4_ = 2;
        auVar192._28_4_ = 2;
        auVar30._8_4_ = 3;
        auVar30._0_8_ = 0x300000003;
        auVar30._12_4_ = 3;
        auVar30._16_4_ = 3;
        auVar30._20_4_ = 3;
        auVar30._24_4_ = 3;
        auVar30._28_4_ = 3;
        auVar108 = vpblendmd_avx512vl(auVar192,auVar30);
        auVar144._0_4_ = (uint)(bVar74 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar74 & 1) * 2;
        bVar7 = (bool)(bVar74 >> 1 & 1);
        auVar144._4_4_ = (uint)bVar7 * auVar108._4_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar74 >> 2 & 1);
        auVar144._8_4_ = (uint)bVar7 * auVar108._8_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar74 >> 3 & 1);
        auVar144._12_4_ = (uint)bVar7 * auVar108._12_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar74 >> 4 & 1);
        auVar144._16_4_ = (uint)bVar7 * auVar108._16_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar74 >> 5 & 1);
        auVar144._20_4_ = (uint)bVar7 * auVar108._20_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar74 >> 6 & 1);
        auVar144._24_4_ = (uint)bVar7 * auVar108._24_4_ | (uint)!bVar7 * 2;
        auVar144._28_4_ = (uint)(bVar74 >> 7) * auVar108._28_4_ | (uint)!(bool)(bVar74 >> 7) * 2;
        uVar17 = vpcmpd_avx512vl(local_500,auVar144,5);
        bVar74 = (byte)uVar17 & bVar70;
        fVar252 = (float)local_7e0._0_4_;
        fVar257 = (float)local_7e0._4_4_;
        fVar258 = fStack_7d8;
        fVar259 = fStack_7d4;
        fVar230 = fStack_7d0;
        fVar231 = fStack_7cc;
        fVar232 = fStack_7c8;
        fVar214 = fStack_7c4;
        if (bVar74 != 0) {
          auVar91 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
          auVar86 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
          auVar84 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar96 = vminps_avx(auVar91,auVar84);
          auVar91 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar84 = vmaxps_avx(auVar86,auVar91);
          auVar201._8_4_ = 0x7fffffff;
          auVar201._0_8_ = 0x7fffffff7fffffff;
          auVar201._12_4_ = 0x7fffffff;
          auVar86 = vandps_avx(auVar96,auVar201);
          auVar91 = vandps_avx(auVar84,auVar201);
          auVar86 = vmaxps_avx(auVar86,auVar91);
          auVar91 = vmovshdup_avx(auVar86);
          auVar91 = vmaxss_avx(auVar91,auVar86);
          auVar86 = vshufpd_avx(auVar86,auVar86,1);
          auVar86 = vmaxss_avx(auVar86,auVar91);
          fVar252 = auVar86._0_4_ * 1.9073486e-06;
          local_6e0 = vshufps_avx(auVar84,auVar84,0xff);
          local_560 = (float)local_7e0._0_4_ + local_380._0_4_;
          fStack_55c = (float)local_7e0._4_4_ + local_380._4_4_;
          fStack_558 = fStack_7d8 + local_380._8_4_;
          fStack_554 = fStack_7d4 + local_380._12_4_;
          fStack_550 = fStack_7d0 + local_380._16_4_;
          fStack_54c = fStack_7cc + local_380._20_4_;
          fStack_548 = fStack_7c8 + local_380._24_4_;
          fStack_544 = fStack_7c4 + local_380._28_4_;
          _local_680 = local_380;
          local_580 = auVar144;
          do {
            auVar170._8_4_ = 0x7f800000;
            auVar170._0_8_ = 0x7f8000007f800000;
            auVar170._12_4_ = 0x7f800000;
            auVar170._16_4_ = 0x7f800000;
            auVar170._20_4_ = 0x7f800000;
            auVar170._24_4_ = 0x7f800000;
            auVar170._28_4_ = 0x7f800000;
            auVar108 = vblendmps_avx512vl(auVar170,_local_680);
            auVar145._0_4_ =
                 (uint)(bVar74 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar74 & 1) * 0x7f800000;
            bVar7 = (bool)(bVar74 >> 1 & 1);
            auVar145._4_4_ = (uint)bVar7 * auVar108._4_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar74 >> 2 & 1);
            auVar145._8_4_ = (uint)bVar7 * auVar108._8_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar74 >> 3 & 1);
            auVar145._12_4_ = (uint)bVar7 * auVar108._12_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar74 >> 4 & 1);
            auVar145._16_4_ = (uint)bVar7 * auVar108._16_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar74 >> 5 & 1);
            auVar145._20_4_ = (uint)bVar7 * auVar108._20_4_ | (uint)!bVar7 * 0x7f800000;
            auVar145._24_4_ =
                 (uint)(bVar74 >> 6) * auVar108._24_4_ | (uint)!(bool)(bVar74 >> 6) * 0x7f800000;
            auVar145._28_4_ = 0x7f800000;
            auVar108 = vshufps_avx(auVar145,auVar145,0xb1);
            auVar108 = vminps_avx(auVar145,auVar108);
            auVar109 = vshufpd_avx(auVar108,auVar108,5);
            auVar108 = vminps_avx(auVar108,auVar109);
            auVar109 = vpermpd_avx2(auVar108,0x4e);
            auVar108 = vminps_avx(auVar108,auVar109);
            uVar17 = vcmpps_avx512vl(auVar145,auVar108,0);
            bVar72 = (byte)uVar17 & bVar74;
            bVar81 = bVar74;
            if (bVar72 != 0) {
              bVar81 = bVar72;
            }
            iVar20 = 0;
            for (uVar83 = (uint)bVar81; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
              iVar20 = iVar20 + 1;
            }
            uVar83 = *(uint *)(local_360 + (uint)(iVar20 << 2));
            fVar257 = auVar15._0_4_;
            auVar86 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar20 << 2)));
            if ((float)local_800._0_4_ < 0.0) {
              local_880._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar20 << 2)));
              fVar257 = sqrtf((float)local_800._0_4_);
              auVar86 = local_880._0_16_;
            }
            local_850._0_4_ = fVar257 * 1.9073486e-06;
            auVar86 = vinsertps_avx(ZEXT416(uVar83),auVar86,0x10);
            auVar261 = ZEXT1664(auVar86);
            lVar80 = 5;
            do {
              uVar177 = auVar261._0_4_;
              auVar159._4_4_ = uVar177;
              auVar159._0_4_ = uVar177;
              auVar159._8_4_ = uVar177;
              auVar159._12_4_ = uVar177;
              auVar86 = vfmadd132ps_fma(auVar159,ZEXT816(0) << 0x40,local_7f0);
              local_740 = auVar261._0_32_;
              auVar91 = vmovshdup_avx(auVar261._0_16_);
              fVar231 = auVar91._0_4_;
              fVar230 = 1.0 - fVar231;
              fVar259 = fVar230 * fVar230 * fVar230;
              fVar257 = fVar231 * fVar231;
              fVar232 = fVar257 * fVar231;
              auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar259),
                                        ZEXT416((uint)fVar232));
              fVar258 = fVar231 * fVar230;
              local_880._0_16_ = ZEXT416((uint)fVar230);
              auVar92 = vfmadd231ss_fma(ZEXT416((uint)(fVar258 * fVar231 * 6.0)),
                                        ZEXT416((uint)(fVar258 * fVar230)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar232),
                                        ZEXT416((uint)fVar259));
              auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar258 * fVar230 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar258 * fVar231)));
              fVar259 = fVar259 * 0.16666667;
              fVar230 = (auVar84._0_4_ + auVar92._0_4_) * 0.16666667;
              fVar231 = (auVar96._0_4_ + auVar85._0_4_) * 0.16666667;
              fVar232 = fVar232 * 0.16666667;
              auVar202._0_4_ = fVar232 * (float)local_7c0._0_4_;
              auVar202._4_4_ = fVar232 * (float)local_7c0._4_4_;
              auVar202._8_4_ = fVar232 * fStack_7b8;
              auVar202._12_4_ = fVar232 * fStack_7b4;
              auVar235._4_4_ = fVar231;
              auVar235._0_4_ = fVar231;
              auVar235._8_4_ = fVar231;
              auVar235._12_4_ = fVar231;
              auVar84 = vfmadd132ps_fma(auVar235,auVar202,local_780._0_16_);
              auVar203._4_4_ = fVar230;
              auVar203._0_4_ = fVar230;
              auVar203._8_4_ = fVar230;
              auVar203._12_4_ = fVar230;
              auVar84 = vfmadd132ps_fma(auVar203,auVar84,local_7a0._0_16_);
              auVar184._4_4_ = fVar259;
              auVar184._0_4_ = fVar259;
              auVar184._8_4_ = fVar259;
              auVar184._12_4_ = fVar259;
              auVar84 = vfmadd132ps_fma(auVar184,auVar84,local_760._0_16_);
              local_600._0_16_ = auVar84;
              auVar84 = vsubps_avx(auVar86,auVar84);
              auVar86 = vdpps_avx(auVar84,auVar84,0x7f);
              local_820._0_16_ = auVar86;
              if (auVar86._0_4_ < 0.0) {
                local_8a0._0_4_ = fVar257;
                local_8c0._0_4_ = fVar258;
                auVar256._0_4_ = sqrtf(auVar86._0_4_);
                auVar256._4_60_ = extraout_var_00;
                auVar86 = auVar256._0_16_;
                fVar258 = (float)local_8c0._0_4_;
              }
              else {
                auVar86 = vsqrtss_avx(auVar86,auVar86);
                local_8a0._0_4_ = fVar257;
              }
              local_620._4_4_ = local_880._0_4_;
              local_620._0_4_ = local_620._4_4_;
              fStack_618 = (float)local_620._4_4_;
              fStack_614 = (float)local_620._4_4_;
              auVar92 = vfnmsub213ss_fma(auVar91,auVar91,ZEXT416((uint)(fVar258 * 4.0)));
              auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar258 * 4.0)),local_880._0_16_,
                                        local_880._0_16_);
              fVar257 = (float)local_620._4_4_ * -(float)local_620._4_4_ * 0.5;
              fVar258 = auVar92._0_4_ * 0.5;
              fVar259 = auVar96._0_4_ * 0.5;
              local_8a0._0_4_ = (float)local_8a0._0_4_ * 0.5;
              auVar221._0_4_ = (float)local_8a0._0_4_ * (float)local_7c0._0_4_;
              auVar221._4_4_ = (float)local_8a0._0_4_ * (float)local_7c0._4_4_;
              auVar221._8_4_ = (float)local_8a0._0_4_ * fStack_7b8;
              auVar221._12_4_ = (float)local_8a0._0_4_ * fStack_7b4;
              auVar185._4_4_ = fVar259;
              auVar185._0_4_ = fVar259;
              auVar185._8_4_ = fVar259;
              auVar185._12_4_ = fVar259;
              auVar96 = vfmadd132ps_fma(auVar185,auVar221,local_780._0_16_);
              auVar204._4_4_ = fVar258;
              auVar204._0_4_ = fVar258;
              auVar204._8_4_ = fVar258;
              auVar204._12_4_ = fVar258;
              auVar96 = vfmadd132ps_fma(auVar204,auVar96,local_7a0._0_16_);
              auVar267._4_4_ = fVar257;
              auVar267._0_4_ = fVar257;
              auVar267._8_4_ = fVar257;
              auVar267._12_4_ = fVar257;
              _local_8a0 = vfmadd132ps_fma(auVar267,auVar96,local_760._0_16_);
              local_640._0_16_ = vdpps_avx(_local_8a0,_local_8a0,0x7f);
              auVar58._12_4_ = 0;
              auVar58._0_12_ = ZEXT812(0);
              fVar257 = local_640._0_4_;
              auVar92 = vrsqrt14ss_avx512f(auVar58 << 0x20,ZEXT416((uint)fVar257));
              local_660._0_16_ = vrcp14ss_avx512f(auVar58 << 0x20,ZEXT416((uint)fVar257));
              auVar96 = vfnmadd213ss_fma(local_660._0_16_,local_640._0_16_,ZEXT416(0x40000000));
              local_840._0_4_ = auVar96._0_4_;
              local_8c0._0_4_ = auVar86._0_4_;
              if (fVar257 < -fVar257) {
                local_860 = auVar92;
                fVar258 = sqrtf(fVar257);
                auVar86 = ZEXT416((uint)local_8c0._0_4_);
                auVar96 = local_860;
                auVar85 = _local_8a0;
              }
              else {
                auVar96 = vsqrtss_avx(local_640._0_16_,local_640._0_16_);
                fVar258 = auVar96._0_4_;
                auVar96 = auVar92;
                auVar85 = _local_8a0;
              }
              fVar259 = auVar96._0_4_;
              auVar89 = vbroadcastss_avx512vl
                                  (ZEXT416((uint)(auVar92._0_4_ * 1.5 +
                                                 fVar257 * -0.5 * fVar259 * fVar259 * fVar259)));
              auVar88 = vmulps_avx512vl(auVar85,auVar89);
              auVar96 = vdpps_avx(auVar84,auVar88,0x7f);
              fVar257 = auVar86._0_4_ + 1.0;
              fVar259 = auVar96._0_4_;
              auVar160._0_4_ = fVar259 * fVar259;
              auVar160._4_4_ = auVar96._4_4_ * auVar96._4_4_;
              auVar160._8_4_ = auVar96._8_4_ * auVar96._8_4_;
              auVar160._12_4_ = auVar96._12_4_ * auVar96._12_4_;
              auVar92 = vsubps_avx(local_820._0_16_,auVar160);
              fVar230 = auVar92._0_4_;
              auVar186._4_12_ = ZEXT812(0) << 0x20;
              auVar186._0_4_ = fVar230;
              auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar186);
              auVar93 = vmulss_avx512f(auVar87,ZEXT416(0x3fc00000));
              auVar94 = vmulss_avx512f(auVar92,ZEXT416(0xbf000000));
              if (fVar230 < 0.0) {
                local_860._0_4_ = fVar257;
                local_6b0._0_4_ = auVar93._0_4_;
                _local_6d0 = auVar89;
                local_6c0 = auVar88;
                local_6a0 = auVar87;
                fVar230 = sqrtf(fVar230);
                auVar94 = ZEXT416(auVar94._0_4_);
                auVar93 = ZEXT416((uint)local_6b0._0_4_);
                auVar86 = ZEXT416((uint)local_8c0._0_4_);
                auVar87 = local_6a0;
                auVar85 = _local_8a0;
                fVar257 = (float)local_860._0_4_;
                auVar88 = local_6c0;
                auVar89 = _local_6d0;
              }
              else {
                auVar92 = vsqrtss_avx(auVar92,auVar92);
                fVar230 = auVar92._0_4_;
              }
              auVar268 = ZEXT1664(auVar85);
              auVar265 = ZEXT1664(local_820._0_16_);
              auVar263 = ZEXT1664(auVar84);
              auVar270 = ZEXT3264(local_8e0);
              auVar271 = ZEXT3264(local_900);
              auVar272 = ZEXT3264(local_920);
              auVar273 = ZEXT3264(local_940);
              auVar92 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_880._0_16_,auVar91);
              auVar90 = vfmadd213ss_fma(auVar91,SUB6416(ZEXT464(0xc0000000),0),local_880._0_16_);
              auVar260 = local_740._0_16_;
              auVar91 = vshufps_avx(auVar260,auVar260,0x55);
              auVar205._0_4_ = auVar91._0_4_ * (float)local_7c0._0_4_;
              auVar205._4_4_ = auVar91._4_4_ * (float)local_7c0._4_4_;
              auVar205._8_4_ = auVar91._8_4_ * fStack_7b8;
              auVar205._12_4_ = auVar91._12_4_ * fStack_7b4;
              auVar222._0_4_ = auVar90._0_4_;
              auVar222._4_4_ = auVar222._0_4_;
              auVar222._8_4_ = auVar222._0_4_;
              auVar222._12_4_ = auVar222._0_4_;
              auVar91 = vfmadd132ps_fma(auVar222,auVar205,local_780._0_16_);
              auVar187._0_4_ = auVar92._0_4_;
              auVar187._4_4_ = auVar187._0_4_;
              auVar187._8_4_ = auVar187._0_4_;
              auVar187._12_4_ = auVar187._0_4_;
              auVar91 = vfmadd132ps_fma(auVar187,auVar91,local_7a0._0_16_);
              auVar91 = vfmadd132ps_fma(_local_620,auVar91,local_760._0_16_);
              auVar188._0_4_ = auVar91._0_4_ * (float)local_640._0_4_;
              auVar188._4_4_ = auVar91._4_4_ * (float)local_640._0_4_;
              auVar188._8_4_ = auVar91._8_4_ * (float)local_640._0_4_;
              auVar188._12_4_ = auVar91._12_4_ * (float)local_640._0_4_;
              auVar91 = vdpps_avx(auVar85,auVar91,0x7f);
              fVar231 = auVar91._0_4_;
              auVar206._0_4_ = auVar85._0_4_ * fVar231;
              auVar206._4_4_ = auVar85._4_4_ * fVar231;
              auVar206._8_4_ = auVar85._8_4_ * fVar231;
              auVar206._12_4_ = auVar85._12_4_ * fVar231;
              auVar91 = vsubps_avx(auVar188,auVar206);
              fVar231 = (float)local_840._0_4_ * (float)local_660._0_4_;
              auVar90 = vmaxss_avx(ZEXT416((uint)fVar252),
                                   ZEXT416((uint)(local_740._0_4_ * (float)local_850._0_4_)));
              auVar207._0_4_ = auVar91._0_4_ * fVar231;
              auVar207._4_4_ = auVar91._4_4_ * fVar231;
              auVar207._8_4_ = auVar91._8_4_ * fVar231;
              auVar207._12_4_ = auVar91._12_4_ * fVar231;
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar95 = vxorps_avx512vl(auVar85,auVar24);
              auVar89 = vmulps_avx512vl(auVar89,auVar207);
              auVar91 = vdpps_avx(auVar95,auVar88,0x7f);
              auVar92 = vfmadd213ss_fma(auVar86,ZEXT416((uint)fVar252),auVar90);
              auVar86 = vdpps_avx(auVar84,auVar89,0x7f);
              auVar89 = vfmadd213ss_fma(ZEXT416((uint)fVar257),ZEXT416((uint)(fVar252 / fVar258)),
                                        auVar92);
              fVar257 = auVar91._0_4_ + auVar86._0_4_;
              auVar86 = vdpps_avx(local_7f0,auVar88,0x7f);
              auVar91 = vdpps_avx(auVar84,auVar95,0x7f);
              auVar92 = vmulss_avx512f(auVar94,auVar87);
              auVar93 = vaddss_avx512f(auVar93,ZEXT416((uint)(auVar92._0_4_ *
                                                             auVar87._0_4_ * auVar87._0_4_)));
              auVar92 = vdpps_avx(auVar84,local_7f0,0x7f);
              auVar88 = vfnmadd231ss_fma(auVar91,auVar96,ZEXT416((uint)fVar257));
              auVar92 = vfnmadd231ss_fma(auVar92,auVar96,auVar86);
              auVar91 = vpermilps_avx(local_600._0_16_,0xff);
              fVar230 = fVar230 - auVar91._0_4_;
              auVar87 = vshufps_avx(auVar85,auVar85,0xff);
              auVar91 = vfmsub213ss_fma(auVar88,auVar93,auVar87);
              auVar254._8_4_ = 0x80000000;
              auVar254._0_8_ = 0x8000000080000000;
              auVar254._12_4_ = 0x80000000;
              auVar256 = ZEXT1664(auVar254);
              auVar249._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
              auVar249._8_4_ = auVar91._8_4_ ^ 0x80000000;
              auVar249._12_4_ = auVar91._12_4_ ^ 0x80000000;
              auVar251 = ZEXT1664(auVar249);
              auVar92 = ZEXT416((uint)(auVar92._0_4_ * auVar93._0_4_));
              auVar88 = vfmsub231ss_fma(ZEXT416((uint)(auVar86._0_4_ * auVar91._0_4_)),
                                        ZEXT416((uint)fVar257),auVar92);
              auVar91 = vinsertps_avx(auVar249,auVar92,0x1c);
              auVar244._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
              auVar244._8_4_ = auVar86._8_4_ ^ 0x80000000;
              auVar244._12_4_ = auVar86._12_4_ ^ 0x80000000;
              auVar92 = vinsertps_avx(ZEXT416((uint)fVar257),auVar244,0x10);
              auVar223._0_4_ = auVar88._0_4_;
              auVar223._4_4_ = auVar223._0_4_;
              auVar223._8_4_ = auVar223._0_4_;
              auVar223._12_4_ = auVar223._0_4_;
              auVar86 = vdivps_avx(auVar91,auVar223);
              auVar91 = vdivps_avx(auVar92,auVar223);
              auVar245 = ZEXT1664(CONCAT412(fVar230,CONCAT48(fVar230,CONCAT44(fVar230,fVar230))));
              auVar224._0_4_ = fVar259 * auVar86._0_4_ + fVar230 * auVar91._0_4_;
              auVar224._4_4_ = fVar259 * auVar86._4_4_ + fVar230 * auVar91._4_4_;
              auVar224._8_4_ = fVar259 * auVar86._8_4_ + fVar230 * auVar91._8_4_;
              auVar224._12_4_ = fVar259 * auVar86._12_4_ + fVar230 * auVar91._12_4_;
              auVar86 = vsubps_avx(auVar260,auVar224);
              auVar261 = ZEXT1664(auVar86);
              auVar25._8_4_ = 0x7fffffff;
              auVar25._0_8_ = 0x7fffffff7fffffff;
              auVar25._12_4_ = 0x7fffffff;
              auVar91 = vandps_avx512vl(auVar96,auVar25);
              if (auVar91._0_4_ < auVar89._0_4_) {
                auVar91 = vfmadd231ss_fma(ZEXT416((uint)(auVar89._0_4_ + auVar90._0_4_)),local_6e0,
                                          ZEXT416(0x36000000));
                auVar26._8_4_ = 0x7fffffff;
                auVar26._0_8_ = 0x7fffffff7fffffff;
                auVar26._12_4_ = 0x7fffffff;
                auVar96 = vandps_avx512vl(ZEXT416((uint)fVar230),auVar26);
                if (auVar96._0_4_ < auVar91._0_4_) {
                  fVar257 = auVar86._0_4_ + (float)local_6f0._0_4_;
                  if ((fVar257 < fVar154) ||
                     (fVar258 = *(float *)(ray + k * 4 + 0x100), fVar258 < fVar257)) break;
                  auVar91 = vmovshdup_avx(auVar86);
                  fVar259 = auVar91._0_4_;
                  if ((fVar259 < 0.0) || (1.0 < fVar259)) break;
                  auVar91 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_820._0_4_));
                  fVar231 = auVar91._0_4_;
                  fVar230 = local_820._0_4_ * -0.5;
                  auVar245 = ZEXT464((uint)fVar230);
                  pGVar4 = (context->scene->geometries).items[uVar79].ptr;
                  if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                  fVar230 = fVar231 * 1.5 + fVar230 * fVar231 * fVar231 * fVar231;
                  auVar225._0_4_ = auVar84._0_4_ * fVar230;
                  auVar225._4_4_ = auVar84._4_4_ * fVar230;
                  auVar225._8_4_ = auVar84._8_4_ * fVar230;
                  auVar225._12_4_ = auVar84._12_4_ * fVar230;
                  auVar87 = vfmadd213ps_fma(auVar87,auVar225,auVar85);
                  auVar91 = vshufps_avx(auVar225,auVar225,0xc9);
                  auVar96 = vshufps_avx(auVar85,auVar85,0xc9);
                  auVar226._0_4_ = auVar225._0_4_ * auVar96._0_4_;
                  auVar226._4_4_ = auVar225._4_4_ * auVar96._4_4_;
                  auVar226._8_4_ = auVar225._8_4_ * auVar96._8_4_;
                  auVar226._12_4_ = auVar225._12_4_ * auVar96._12_4_;
                  auVar92 = vfmsub231ps_fma(auVar226,auVar85,auVar91);
                  auVar91 = vshufps_avx(auVar92,auVar92,0xc9);
                  auVar96 = vshufps_avx(auVar87,auVar87,0xc9);
                  auVar245 = ZEXT1664(auVar96);
                  auVar92 = vshufps_avx(auVar92,auVar92,0xd2);
                  auVar161._0_4_ = auVar87._0_4_ * auVar92._0_4_;
                  auVar161._4_4_ = auVar87._4_4_ * auVar92._4_4_;
                  auVar161._8_4_ = auVar87._8_4_ * auVar92._8_4_;
                  auVar161._12_4_ = auVar87._12_4_ * auVar92._12_4_;
                  auVar91 = vfmsub231ps_fma(auVar161,auVar91,auVar96);
                  uVar177 = auVar91._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar257;
                    uVar3 = vextractps_avx(auVar91,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar3;
                    uVar3 = vextractps_avx(auVar91,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar3;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar177;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar259;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(uint *)(ray + k * 4 + 0x220) = uVar2;
                    *(uint *)(ray + k * 4 + 0x240) = uVar79;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar6 = context->user;
                  auVar229._8_4_ = 1;
                  auVar229._0_8_ = 0x100000001;
                  auVar229._12_4_ = 1;
                  auVar229._16_4_ = 1;
                  auVar229._20_4_ = 1;
                  auVar229._24_4_ = 1;
                  auVar229._28_4_ = 1;
                  local_440 = vpermps_avx2(auVar229,ZEXT1632(auVar86));
                  auVar108 = vpermps_avx2(auVar229,ZEXT1632(auVar91));
                  auVar239._8_4_ = 2;
                  auVar239._0_8_ = 0x200000002;
                  auVar239._12_4_ = 2;
                  auVar239._16_4_ = 2;
                  auVar239._20_4_ = 2;
                  auVar239._24_4_ = 2;
                  auVar239._28_4_ = 2;
                  local_480 = vpermps_avx2(auVar239,ZEXT1632(auVar91));
                  local_4a0[0] = (RTCHitN)auVar108[0];
                  local_4a0[1] = (RTCHitN)auVar108[1];
                  local_4a0[2] = (RTCHitN)auVar108[2];
                  local_4a0[3] = (RTCHitN)auVar108[3];
                  local_4a0[4] = (RTCHitN)auVar108[4];
                  local_4a0[5] = (RTCHitN)auVar108[5];
                  local_4a0[6] = (RTCHitN)auVar108[6];
                  local_4a0[7] = (RTCHitN)auVar108[7];
                  local_4a0[8] = (RTCHitN)auVar108[8];
                  local_4a0[9] = (RTCHitN)auVar108[9];
                  local_4a0[10] = (RTCHitN)auVar108[10];
                  local_4a0[0xb] = (RTCHitN)auVar108[0xb];
                  local_4a0[0xc] = (RTCHitN)auVar108[0xc];
                  local_4a0[0xd] = (RTCHitN)auVar108[0xd];
                  local_4a0[0xe] = (RTCHitN)auVar108[0xe];
                  local_4a0[0xf] = (RTCHitN)auVar108[0xf];
                  local_4a0[0x10] = (RTCHitN)auVar108[0x10];
                  local_4a0[0x11] = (RTCHitN)auVar108[0x11];
                  local_4a0[0x12] = (RTCHitN)auVar108[0x12];
                  local_4a0[0x13] = (RTCHitN)auVar108[0x13];
                  local_4a0[0x14] = (RTCHitN)auVar108[0x14];
                  local_4a0[0x15] = (RTCHitN)auVar108[0x15];
                  local_4a0[0x16] = (RTCHitN)auVar108[0x16];
                  local_4a0[0x17] = (RTCHitN)auVar108[0x17];
                  local_4a0[0x18] = (RTCHitN)auVar108[0x18];
                  local_4a0[0x19] = (RTCHitN)auVar108[0x19];
                  local_4a0[0x1a] = (RTCHitN)auVar108[0x1a];
                  local_4a0[0x1b] = (RTCHitN)auVar108[0x1b];
                  local_4a0[0x1c] = (RTCHitN)auVar108[0x1c];
                  local_4a0[0x1d] = (RTCHitN)auVar108[0x1d];
                  local_4a0[0x1e] = (RTCHitN)auVar108[0x1e];
                  local_4a0[0x1f] = (RTCHitN)auVar108[0x1f];
                  local_460 = uVar177;
                  uStack_45c = uVar177;
                  uStack_458 = uVar177;
                  uStack_454 = uVar177;
                  uStack_450 = uVar177;
                  uStack_44c = uVar177;
                  uStack_448 = uVar177;
                  uStack_444 = uVar177;
                  local_420 = ZEXT432(0) << 0x20;
                  local_400 = local_4e0._0_8_;
                  uStack_3f8 = local_4e0._8_8_;
                  uStack_3f0 = local_4e0._16_8_;
                  uStack_3e8 = local_4e0._24_8_;
                  local_3e0 = local_4c0;
                  auVar108 = vpcmpeqd_avx2(local_4c0,local_4c0);
                  local_828[1] = auVar108;
                  *local_828 = auVar108;
                  local_3c0 = pRVar6->instID[0];
                  uStack_3bc = local_3c0;
                  uStack_3b8 = local_3c0;
                  uStack_3b4 = local_3c0;
                  uStack_3b0 = local_3c0;
                  uStack_3ac = local_3c0;
                  uStack_3a8 = local_3c0;
                  uStack_3a4 = local_3c0;
                  local_3a0 = pRVar6->instPrimID[0];
                  uStack_39c = local_3a0;
                  uStack_398 = local_3a0;
                  uStack_394 = local_3a0;
                  uStack_390 = local_3a0;
                  uStack_38c = local_3a0;
                  uStack_388 = local_3a0;
                  uStack_384 = local_3a0;
                  *(float *)(ray + k * 4 + 0x100) = fVar257;
                  local_720 = local_520;
                  local_970.valid = (int *)local_720;
                  local_970.geometryUserPtr = pGVar4->userPtr;
                  local_970.context = context->user;
                  local_970.hit = local_4a0;
                  local_970.N = 8;
                  local_970.ray = (RTCRayN *)ray;
                  if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar245 = ZEXT1664(auVar96);
                    auVar251 = ZEXT1664(auVar249);
                    auVar256 = ZEXT1664(auVar254);
                    auVar261 = ZEXT1664(auVar86);
                    auVar263 = ZEXT1664(auVar84);
                    auVar265 = ZEXT1664(local_820._0_16_);
                    auVar268 = ZEXT1664(auVar85);
                    (*pGVar4->intersectionFilterN)(&local_970);
                    auVar273 = ZEXT3264(local_940);
                    auVar272 = ZEXT3264(local_920);
                    auVar271 = ZEXT3264(local_900);
                    auVar270 = ZEXT3264(local_8e0);
                  }
                  if (local_720 != (undefined1  [32])0x0) {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar245 = ZEXT1664(auVar245._0_16_);
                      auVar251 = ZEXT1664(auVar251._0_16_);
                      auVar256 = ZEXT1664(auVar256._0_16_);
                      auVar261 = ZEXT1664(auVar261._0_16_);
                      auVar263 = ZEXT1664(auVar263._0_16_);
                      auVar265 = ZEXT1664(auVar265._0_16_);
                      auVar268 = ZEXT1664(auVar268._0_16_);
                      (*p_Var5)(&local_970);
                      auVar273 = ZEXT3264(local_940);
                      auVar272 = ZEXT3264(local_920);
                      auVar271 = ZEXT3264(local_900);
                      auVar270 = ZEXT3264(local_8e0);
                    }
                    if (local_720 != (undefined1  [32])0x0) {
                      uVar78 = vptestmd_avx512vl(local_720,local_720);
                      iVar59 = *(int *)(local_970.hit + 4);
                      iVar60 = *(int *)(local_970.hit + 8);
                      iVar61 = *(int *)(local_970.hit + 0xc);
                      iVar62 = *(int *)(local_970.hit + 0x10);
                      iVar63 = *(int *)(local_970.hit + 0x14);
                      iVar64 = *(int *)(local_970.hit + 0x18);
                      iVar65 = *(int *)(local_970.hit + 0x1c);
                      bVar81 = (byte)uVar78;
                      bVar7 = (bool)((byte)(uVar78 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar78 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar78 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar78 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar78 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar78 >> 6) & 1);
                      bVar13 = SUB81(uVar78 >> 7,0);
                      *(uint *)(local_970.ray + 0x180) =
                           (uint)(bVar81 & 1) * *(int *)local_970.hit |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_970.ray + 0x180);
                      *(uint *)(local_970.ray + 0x184) =
                           (uint)bVar7 * iVar59 | (uint)!bVar7 * *(int *)(local_970.ray + 0x184);
                      *(uint *)(local_970.ray + 0x188) =
                           (uint)bVar8 * iVar60 | (uint)!bVar8 * *(int *)(local_970.ray + 0x188);
                      *(uint *)(local_970.ray + 0x18c) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_970.ray + 0x18c);
                      *(uint *)(local_970.ray + 400) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_970.ray + 400);
                      *(uint *)(local_970.ray + 0x194) =
                           (uint)bVar11 * iVar63 | (uint)!bVar11 * *(int *)(local_970.ray + 0x194);
                      *(uint *)(local_970.ray + 0x198) =
                           (uint)bVar12 * iVar64 | (uint)!bVar12 * *(int *)(local_970.ray + 0x198);
                      *(uint *)(local_970.ray + 0x19c) =
                           (uint)bVar13 * iVar65 | (uint)!bVar13 * *(int *)(local_970.ray + 0x19c);
                      iVar59 = *(int *)(local_970.hit + 0x24);
                      iVar60 = *(int *)(local_970.hit + 0x28);
                      iVar61 = *(int *)(local_970.hit + 0x2c);
                      iVar62 = *(int *)(local_970.hit + 0x30);
                      iVar63 = *(int *)(local_970.hit + 0x34);
                      iVar64 = *(int *)(local_970.hit + 0x38);
                      iVar65 = *(int *)(local_970.hit + 0x3c);
                      bVar7 = (bool)((byte)(uVar78 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar78 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar78 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar78 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar78 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar78 >> 6) & 1);
                      bVar13 = SUB81(uVar78 >> 7,0);
                      *(uint *)(local_970.ray + 0x1a0) =
                           (uint)(bVar81 & 1) * *(int *)(local_970.hit + 0x20) |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_970.ray + 0x1a0);
                      *(uint *)(local_970.ray + 0x1a4) =
                           (uint)bVar7 * iVar59 | (uint)!bVar7 * *(int *)(local_970.ray + 0x1a4);
                      *(uint *)(local_970.ray + 0x1a8) =
                           (uint)bVar8 * iVar60 | (uint)!bVar8 * *(int *)(local_970.ray + 0x1a8);
                      *(uint *)(local_970.ray + 0x1ac) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_970.ray + 0x1ac);
                      *(uint *)(local_970.ray + 0x1b0) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_970.ray + 0x1b0);
                      *(uint *)(local_970.ray + 0x1b4) =
                           (uint)bVar11 * iVar63 | (uint)!bVar11 * *(int *)(local_970.ray + 0x1b4);
                      *(uint *)(local_970.ray + 0x1b8) =
                           (uint)bVar12 * iVar64 | (uint)!bVar12 * *(int *)(local_970.ray + 0x1b8);
                      *(uint *)(local_970.ray + 0x1bc) =
                           (uint)bVar13 * iVar65 | (uint)!bVar13 * *(int *)(local_970.ray + 0x1bc);
                      iVar59 = *(int *)(local_970.hit + 0x44);
                      iVar60 = *(int *)(local_970.hit + 0x48);
                      iVar61 = *(int *)(local_970.hit + 0x4c);
                      iVar62 = *(int *)(local_970.hit + 0x50);
                      iVar63 = *(int *)(local_970.hit + 0x54);
                      iVar64 = *(int *)(local_970.hit + 0x58);
                      iVar65 = *(int *)(local_970.hit + 0x5c);
                      bVar7 = (bool)((byte)(uVar78 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar78 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar78 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar78 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar78 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar78 >> 6) & 1);
                      bVar13 = SUB81(uVar78 >> 7,0);
                      *(uint *)(local_970.ray + 0x1c0) =
                           (uint)(bVar81 & 1) * *(int *)(local_970.hit + 0x40) |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_970.ray + 0x1c0);
                      *(uint *)(local_970.ray + 0x1c4) =
                           (uint)bVar7 * iVar59 | (uint)!bVar7 * *(int *)(local_970.ray + 0x1c4);
                      *(uint *)(local_970.ray + 0x1c8) =
                           (uint)bVar8 * iVar60 | (uint)!bVar8 * *(int *)(local_970.ray + 0x1c8);
                      *(uint *)(local_970.ray + 0x1cc) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_970.ray + 0x1cc);
                      *(uint *)(local_970.ray + 0x1d0) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_970.ray + 0x1d0);
                      *(uint *)(local_970.ray + 0x1d4) =
                           (uint)bVar11 * iVar63 | (uint)!bVar11 * *(int *)(local_970.ray + 0x1d4);
                      *(uint *)(local_970.ray + 0x1d8) =
                           (uint)bVar12 * iVar64 | (uint)!bVar12 * *(int *)(local_970.ray + 0x1d8);
                      *(uint *)(local_970.ray + 0x1dc) =
                           (uint)bVar13 * iVar65 | (uint)!bVar13 * *(int *)(local_970.ray + 0x1dc);
                      iVar59 = *(int *)(local_970.hit + 100);
                      iVar60 = *(int *)(local_970.hit + 0x68);
                      iVar61 = *(int *)(local_970.hit + 0x6c);
                      iVar62 = *(int *)(local_970.hit + 0x70);
                      iVar63 = *(int *)(local_970.hit + 0x74);
                      iVar64 = *(int *)(local_970.hit + 0x78);
                      iVar65 = *(int *)(local_970.hit + 0x7c);
                      bVar7 = (bool)((byte)(uVar78 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar78 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar78 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar78 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar78 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar78 >> 6) & 1);
                      bVar13 = SUB81(uVar78 >> 7,0);
                      *(uint *)(local_970.ray + 0x1e0) =
                           (uint)(bVar81 & 1) * *(int *)(local_970.hit + 0x60) |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_970.ray + 0x1e0);
                      *(uint *)(local_970.ray + 0x1e4) =
                           (uint)bVar7 * iVar59 | (uint)!bVar7 * *(int *)(local_970.ray + 0x1e4);
                      *(uint *)(local_970.ray + 0x1e8) =
                           (uint)bVar8 * iVar60 | (uint)!bVar8 * *(int *)(local_970.ray + 0x1e8);
                      *(uint *)(local_970.ray + 0x1ec) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_970.ray + 0x1ec);
                      *(uint *)(local_970.ray + 0x1f0) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_970.ray + 0x1f0);
                      *(uint *)(local_970.ray + 500) =
                           (uint)bVar11 * iVar63 | (uint)!bVar11 * *(int *)(local_970.ray + 500);
                      *(uint *)(local_970.ray + 0x1f8) =
                           (uint)bVar12 * iVar64 | (uint)!bVar12 * *(int *)(local_970.ray + 0x1f8);
                      *(uint *)(local_970.ray + 0x1fc) =
                           (uint)bVar13 * iVar65 | (uint)!bVar13 * *(int *)(local_970.ray + 0x1fc);
                      iVar59 = *(int *)(local_970.hit + 0x84);
                      iVar60 = *(int *)(local_970.hit + 0x88);
                      iVar61 = *(int *)(local_970.hit + 0x8c);
                      iVar62 = *(int *)(local_970.hit + 0x90);
                      iVar63 = *(int *)(local_970.hit + 0x94);
                      iVar64 = *(int *)(local_970.hit + 0x98);
                      iVar65 = *(int *)(local_970.hit + 0x9c);
                      bVar7 = (bool)((byte)(uVar78 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar78 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar78 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar78 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar78 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar78 >> 6) & 1);
                      bVar13 = SUB81(uVar78 >> 7,0);
                      *(uint *)(local_970.ray + 0x200) =
                           (uint)(bVar81 & 1) * *(int *)(local_970.hit + 0x80) |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_970.ray + 0x200);
                      *(uint *)(local_970.ray + 0x204) =
                           (uint)bVar7 * iVar59 | (uint)!bVar7 * *(int *)(local_970.ray + 0x204);
                      *(uint *)(local_970.ray + 0x208) =
                           (uint)bVar8 * iVar60 | (uint)!bVar8 * *(int *)(local_970.ray + 0x208);
                      *(uint *)(local_970.ray + 0x20c) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_970.ray + 0x20c);
                      *(uint *)(local_970.ray + 0x210) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_970.ray + 0x210);
                      *(uint *)(local_970.ray + 0x214) =
                           (uint)bVar11 * iVar63 | (uint)!bVar11 * *(int *)(local_970.ray + 0x214);
                      *(uint *)(local_970.ray + 0x218) =
                           (uint)bVar12 * iVar64 | (uint)!bVar12 * *(int *)(local_970.ray + 0x218);
                      *(uint *)(local_970.ray + 0x21c) =
                           (uint)bVar13 * iVar65 | (uint)!bVar13 * *(int *)(local_970.ray + 0x21c);
                      auVar108 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_970.hit + 0xa0));
                      *(undefined1 (*) [32])(local_970.ray + 0x220) = auVar108;
                      auVar108 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_970.hit + 0xc0));
                      *(undefined1 (*) [32])(local_970.ray + 0x240) = auVar108;
                      auVar108 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_970.hit + 0xe0));
                      *(undefined1 (*) [32])(local_970.ray + 0x260) = auVar108;
                      auVar108 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_970.hit + 0x100));
                      *(undefined1 (*) [32])(local_970.ray + 0x280) = auVar108;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar258;
                  break;
                }
              }
              lVar80 = lVar80 + -1;
            } while (lVar80 != 0);
            uVar177 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar169._4_4_ = uVar177;
            auVar169._0_4_ = uVar177;
            auVar169._8_4_ = uVar177;
            auVar169._12_4_ = uVar177;
            auVar169._16_4_ = uVar177;
            auVar169._20_4_ = uVar177;
            auVar169._24_4_ = uVar177;
            auVar169._28_4_ = uVar177;
            auVar67._4_4_ = fStack_55c;
            auVar67._0_4_ = local_560;
            auVar67._8_4_ = fStack_558;
            auVar67._12_4_ = fStack_554;
            auVar67._16_4_ = fStack_550;
            auVar67._20_4_ = fStack_54c;
            auVar67._24_4_ = fStack_548;
            auVar67._28_4_ = fStack_544;
            uVar17 = vcmpps_avx512vl(auVar169,auVar67,0xd);
            bVar74 = ~('\x01' << ((byte)iVar20 & 0x1f)) & bVar74 & (byte)uVar17;
          } while (bVar74 != 0);
          auVar144 = local_580;
          fVar252 = (float)local_7e0._0_4_;
          fVar257 = (float)local_7e0._4_4_;
          fVar258 = fStack_7d8;
          fVar259 = fStack_7d4;
          fVar230 = fStack_7d0;
          fVar231 = fStack_7cc;
          fVar232 = fStack_7c8;
          fVar214 = fStack_7c4;
        }
        uVar18 = vpcmpgtd_avx512vl(auVar144,local_500);
        uVar19 = vpcmpd_avx512vl(local_500,local_320,1);
        auVar209._0_4_ = fVar252 + (float)local_200._0_4_;
        auVar209._4_4_ = fVar257 + (float)local_200._4_4_;
        auVar209._8_4_ = fVar258 + fStack_1f8;
        auVar209._12_4_ = fVar259 + fStack_1f4;
        auVar209._16_4_ = fVar230 + fStack_1f0;
        auVar209._20_4_ = fVar231 + fStack_1ec;
        auVar209._24_4_ = fVar232 + fStack_1e8;
        auVar209._28_4_ = fVar214 + fStack_1e4;
        uVar17 = vcmpps_avx512vl(auVar209,auVar169,2);
        bVar75 = bVar75 & (byte)uVar19 & (byte)uVar17;
        auVar210._0_4_ = fVar252 + local_380._0_4_;
        auVar210._4_4_ = fVar257 + local_380._4_4_;
        auVar210._8_4_ = fVar258 + local_380._8_4_;
        auVar210._12_4_ = fVar259 + local_380._12_4_;
        auVar210._16_4_ = fVar230 + local_380._16_4_;
        auVar210._20_4_ = fVar231 + local_380._20_4_;
        auVar210._24_4_ = fVar232 + local_380._24_4_;
        auVar210._28_4_ = fVar214 + local_380._28_4_;
        uVar17 = vcmpps_avx512vl(auVar210,auVar169,2);
        bVar70 = bVar70 & (byte)uVar18 & (byte)uVar17 | bVar75;
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar274 = ZEXT3264(auVar108);
        prim = local_690;
        if (bVar70 != 0) {
          abStack_180[uVar76 * 0x60] = bVar70;
          auVar146._0_4_ =
               (uint)(bVar75 & 1) * local_200._0_4_ |
               (uint)!(bool)(bVar75 & 1) * (int)local_380._0_4_;
          bVar7 = (bool)(bVar75 >> 1 & 1);
          auVar146._4_4_ = (uint)bVar7 * local_200._4_4_ | (uint)!bVar7 * (int)local_380._4_4_;
          bVar7 = (bool)(bVar75 >> 2 & 1);
          auVar146._8_4_ = (uint)bVar7 * (int)fStack_1f8 | (uint)!bVar7 * (int)local_380._8_4_;
          bVar7 = (bool)(bVar75 >> 3 & 1);
          auVar146._12_4_ = (uint)bVar7 * (int)fStack_1f4 | (uint)!bVar7 * (int)local_380._12_4_;
          bVar7 = (bool)(bVar75 >> 4 & 1);
          auVar146._16_4_ = (uint)bVar7 * (int)fStack_1f0 | (uint)!bVar7 * (int)local_380._16_4_;
          bVar7 = (bool)(bVar75 >> 5 & 1);
          auVar146._20_4_ = (uint)bVar7 * (int)fStack_1ec | (uint)!bVar7 * (int)local_380._20_4_;
          auVar146._24_4_ =
               (uint)(bVar75 >> 6) * (int)fStack_1e8 |
               (uint)!(bool)(bVar75 >> 6) * (int)local_380._24_4_;
          auVar146._28_4_ = local_380._28_4_;
          *(undefined1 (*) [32])(auStack_160 + uVar76 * 0x60) = auVar146;
          uVar78 = vmovlps_avx(local_530);
          (&uStack_140)[uVar76 * 0xc] = uVar78;
          aiStack_138[uVar76 * 0x18] = iVar77 + 1;
          uVar76 = (ulong)((int)uVar76 + 1);
        }
      }
    }
    do {
      uVar83 = (uint)uVar76;
      uVar76 = (ulong)(uVar83 - 1);
      if (uVar83 == 0) {
        uVar177 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar32._4_4_ = uVar177;
        auVar32._0_4_ = uVar177;
        auVar32._8_4_ = uVar177;
        auVar32._12_4_ = uVar177;
        auVar32._16_4_ = uVar177;
        auVar32._20_4_ = uVar177;
        auVar32._24_4_ = uVar177;
        auVar32._28_4_ = uVar177;
        uVar17 = vcmpps_avx512vl(local_300,auVar32,2);
        uVar79 = (uint)local_688 & (uint)uVar17;
        local_688 = (ulong)uVar79;
        if (uVar79 == 0) {
          return;
        }
        goto LAB_01d705c1;
      }
      lVar80 = uVar76 * 0x60;
      auVar108 = *(undefined1 (*) [32])(auStack_160 + lVar80);
      auVar189._0_4_ = fVar252 + auVar108._0_4_;
      auVar189._4_4_ = fVar257 + auVar108._4_4_;
      auVar189._8_4_ = fVar258 + auVar108._8_4_;
      auVar189._12_4_ = fVar259 + auVar108._12_4_;
      auVar189._16_4_ = fVar230 + auVar108._16_4_;
      auVar189._20_4_ = fVar231 + auVar108._20_4_;
      auVar189._24_4_ = fVar232 + auVar108._24_4_;
      auVar189._28_4_ = fVar214 + auVar108._28_4_;
      uVar177 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar31._4_4_ = uVar177;
      auVar31._0_4_ = uVar177;
      auVar31._8_4_ = uVar177;
      auVar31._12_4_ = uVar177;
      auVar31._16_4_ = uVar177;
      auVar31._20_4_ = uVar177;
      auVar31._24_4_ = uVar177;
      auVar31._28_4_ = uVar177;
      uVar17 = vcmpps_avx512vl(auVar189,auVar31,2);
      uVar82 = (uint)uVar17 & (uint)abStack_180[lVar80];
    } while (uVar82 == 0);
    uVar78 = (&uStack_140)[uVar76 * 0xc];
    auVar178._8_8_ = 0;
    auVar178._0_8_ = uVar78;
    auVar208._8_4_ = 0x7f800000;
    auVar208._0_8_ = 0x7f8000007f800000;
    auVar208._12_4_ = 0x7f800000;
    auVar208._16_4_ = 0x7f800000;
    auVar208._20_4_ = 0x7f800000;
    auVar208._24_4_ = 0x7f800000;
    auVar208._28_4_ = 0x7f800000;
    auVar109 = vblendmps_avx512vl(auVar208,auVar108);
    bVar70 = (byte)uVar82;
    auVar142._0_4_ =
         (uint)(bVar70 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar70 & 1) * (int)auVar108._0_4_;
    bVar7 = (bool)((byte)(uVar82 >> 1) & 1);
    auVar142._4_4_ = (uint)bVar7 * auVar109._4_4_ | (uint)!bVar7 * (int)auVar108._4_4_;
    bVar7 = (bool)((byte)(uVar82 >> 2) & 1);
    auVar142._8_4_ = (uint)bVar7 * auVar109._8_4_ | (uint)!bVar7 * (int)auVar108._8_4_;
    bVar7 = (bool)((byte)(uVar82 >> 3) & 1);
    auVar142._12_4_ = (uint)bVar7 * auVar109._12_4_ | (uint)!bVar7 * (int)auVar108._12_4_;
    bVar7 = (bool)((byte)(uVar82 >> 4) & 1);
    auVar142._16_4_ = (uint)bVar7 * auVar109._16_4_ | (uint)!bVar7 * (int)auVar108._16_4_;
    bVar7 = (bool)((byte)(uVar82 >> 5) & 1);
    auVar142._20_4_ = (uint)bVar7 * auVar109._20_4_ | (uint)!bVar7 * (int)auVar108._20_4_;
    bVar7 = (bool)((byte)(uVar82 >> 6) & 1);
    auVar142._24_4_ = (uint)bVar7 * auVar109._24_4_ | (uint)!bVar7 * (int)auVar108._24_4_;
    auVar142._28_4_ =
         (uVar82 >> 7) * auVar109._28_4_ | (uint)!SUB41(uVar82 >> 7,0) * (int)auVar108._28_4_;
    auVar108 = vshufps_avx(auVar142,auVar142,0xb1);
    auVar108 = vminps_avx(auVar142,auVar108);
    auVar109 = vshufpd_avx(auVar108,auVar108,5);
    auVar108 = vminps_avx(auVar108,auVar109);
    auVar109 = vpermpd_avx2(auVar108,0x4e);
    auVar108 = vminps_avx(auVar108,auVar109);
    uVar17 = vcmpps_avx512vl(auVar142,auVar108,0);
    bVar74 = (byte)uVar17 & bVar70;
    if (bVar74 != 0) {
      uVar82 = (uint)bVar74;
    }
    uVar147 = 0;
    for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
      uVar147 = uVar147 + 1;
    }
    iVar77 = aiStack_138[uVar76 * 0x18];
    bVar70 = ~('\x01' << ((byte)uVar147 & 0x1f)) & bVar70;
    abStack_180[lVar80] = bVar70;
    if (bVar70 == 0) {
      uVar83 = uVar83 - 1;
    }
    uVar177 = (undefined4)uVar78;
    auVar165._4_4_ = uVar177;
    auVar165._0_4_ = uVar177;
    auVar165._8_4_ = uVar177;
    auVar165._12_4_ = uVar177;
    auVar165._16_4_ = uVar177;
    auVar165._20_4_ = uVar177;
    auVar165._24_4_ = uVar177;
    auVar165._28_4_ = uVar177;
    auVar86 = vmovshdup_avx(auVar178);
    auVar86 = vsubps_avx(auVar86,auVar178);
    auVar190._0_4_ = auVar86._0_4_;
    auVar190._4_4_ = auVar190._0_4_;
    auVar190._8_4_ = auVar190._0_4_;
    auVar190._12_4_ = auVar190._0_4_;
    auVar190._16_4_ = auVar190._0_4_;
    auVar190._20_4_ = auVar190._0_4_;
    auVar190._24_4_ = auVar190._0_4_;
    auVar190._28_4_ = auVar190._0_4_;
    auVar86 = vfmadd132ps_fma(auVar190,auVar165,_DAT_01faff20);
    auVar108 = ZEXT1632(auVar86);
    local_4a0[0] = (RTCHitN)auVar108[0];
    local_4a0[1] = (RTCHitN)auVar108[1];
    local_4a0[2] = (RTCHitN)auVar108[2];
    local_4a0[3] = (RTCHitN)auVar108[3];
    local_4a0[4] = (RTCHitN)auVar108[4];
    local_4a0[5] = (RTCHitN)auVar108[5];
    local_4a0[6] = (RTCHitN)auVar108[6];
    local_4a0[7] = (RTCHitN)auVar108[7];
    local_4a0[8] = (RTCHitN)auVar108[8];
    local_4a0[9] = (RTCHitN)auVar108[9];
    local_4a0[10] = (RTCHitN)auVar108[10];
    local_4a0[0xb] = (RTCHitN)auVar108[0xb];
    local_4a0[0xc] = (RTCHitN)auVar108[0xc];
    local_4a0[0xd] = (RTCHitN)auVar108[0xd];
    local_4a0[0xe] = (RTCHitN)auVar108[0xe];
    local_4a0[0xf] = (RTCHitN)auVar108[0xf];
    local_4a0[0x10] = (RTCHitN)auVar108[0x10];
    local_4a0[0x11] = (RTCHitN)auVar108[0x11];
    local_4a0[0x12] = (RTCHitN)auVar108[0x12];
    local_4a0[0x13] = (RTCHitN)auVar108[0x13];
    local_4a0[0x14] = (RTCHitN)auVar108[0x14];
    local_4a0[0x15] = (RTCHitN)auVar108[0x15];
    local_4a0[0x16] = (RTCHitN)auVar108[0x16];
    local_4a0[0x17] = (RTCHitN)auVar108[0x17];
    local_4a0[0x18] = (RTCHitN)auVar108[0x18];
    local_4a0[0x19] = (RTCHitN)auVar108[0x19];
    local_4a0[0x1a] = (RTCHitN)auVar108[0x1a];
    local_4a0[0x1b] = (RTCHitN)auVar108[0x1b];
    local_4a0[0x1c] = (RTCHitN)auVar108[0x1c];
    local_4a0[0x1d] = (RTCHitN)auVar108[0x1d];
    local_4a0[0x1e] = (RTCHitN)auVar108[0x1e];
    local_4a0[0x1f] = (RTCHitN)auVar108[0x1f];
    local_530._8_8_ = 0;
    local_530._0_8_ = *(ulong *)(local_4a0 + (ulong)uVar147 * 4);
    uVar76 = (ulong)uVar83;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }